

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

_Bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBitVector *this;
  ImBitVector *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ImWchar IVar6;
  undefined2 uVar7;
  uint uVar8;
  ImFont *pIVar9;
  ImFont *pIVar10;
  undefined8 *puVar11;
  ImFontConfig_conflict *pIVar12;
  char cVar13;
  char cVar18;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  undefined1 auVar37 [15];
  undefined1 auVar38 [14];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [14];
  undefined1 auVar43 [16];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  stbtt__buf fontdict;
  undefined1 auVar48 [15];
  unkuint9 Var49;
  undefined1 auVar50 [15];
  undefined1 auVar51 [13];
  undefined1 auVar52 [14];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [15];
  unkbyte10 Var56;
  uint6 uVar57;
  undefined1 auVar58 [14];
  undefined1 auVar59 [16];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  stbtt__active_edge **ppsVar62;
  bool bVar63;
  ushort uVar64;
  ushort uVar65;
  short sVar66;
  stbtt_uint32 sVar67;
  uint uVar75;
  int iVar76;
  int iVar77;
  void *p;
  ulong uVar78;
  stbtt_uint32 sVar68;
  stbtt_uint32 sVar69;
  stbtt_uint32 sVar70;
  stbtt_uint32 sVar71;
  stbtt_uint32 sVar72;
  stbtt_uint32 sVar73;
  stbtt_uint32 sVar74;
  int *piVar79;
  void *pvVar80;
  void *pvVar81;
  stbrp_context_conflict *ptr;
  uchar *puVar82;
  stbtt__buf *scanline;
  undefined1 auVar83 [8];
  undefined8 *puVar84;
  stbtt__active_edge *psVar85;
  stbtt__buf *psVar86;
  bool bVar87;
  short sVar88;
  uint uVar89;
  uint uVar90;
  long lVar91;
  ImWchar *pIVar92;
  char *__function;
  int iVar93;
  ulong uVar94;
  long lVar95;
  bool bVar96;
  wchar_t wVar97;
  long lVar98;
  stbtt_fontinfo_conflict *psVar99;
  ImFontConfig_conflict *pIVar100;
  size_t sVar101;
  float fVar102;
  ushort *puVar103;
  stbtt__edge *psVar104;
  ulong uVar105;
  ulong uVar106;
  uint *ptr_00;
  stbrp_node_conflict **ppsVar107;
  byte *pbVar108;
  wchar_t wVar109;
  long lVar110;
  stbtt__edge *psVar111;
  uint uVar112;
  int iVar113;
  int iVar114;
  byte *pbVar115;
  ImFontAtlas_conflict *atlas_00;
  ImU32 bit_n;
  uint uVar116;
  long lVar117;
  byte bVar118;
  char cVar125;
  char cVar126;
  char cVar128;
  ushort uVar127;
  short sVar129;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar130;
  uint uVar135;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  uint uVar136;
  undefined1 auVar134 [16];
  uint uVar137;
  uint uVar141;
  undefined1 auVar138 [16];
  uint uVar142;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  uint uVar143;
  uint uVar147;
  undefined1 in_XMM3 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  uint uVar148;
  undefined1 auVar146 [16];
  float fVar155;
  float fVar156;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar157;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  int iVar158;
  float fVar159;
  float fVar164;
  uint uVar165;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar166;
  float fVar167;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  short sVar168;
  float fVar169;
  float fVar177;
  uint uVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar175 [16];
  float fVar181;
  float fVar185;
  float fVar186;
  float fVar187;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  short sVar188;
  uint uVar198;
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  stbtt__buf sVar205;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  stbtt_uint32 fdarrayoff;
  ImVector<stbrp_rect> buf_rects;
  ImVector<stbtt_packedchar> buf_packedchars;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffb08;
  undefined1 in_stack_fffffffffffffb0c [12];
  void *local_4d8;
  undefined4 in_stack_fffffffffffffb34;
  uint *puVar206;
  stbtt_uint32 local_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [8];
  float fStack_480;
  float fStack_47c;
  ImFontAtlas_conflict *local_478;
  ulong local_470;
  undefined1 local_468 [16];
  ImFontConfig_conflict *local_450;
  undefined1 local_448 [8];
  stbrp_node_conflict *local_440;
  stbtt__edge *local_438;
  float local_42c;
  ulong local_428;
  void *local_420;
  stbtt__active_edge *local_418;
  undefined8 local_410;
  int local_404;
  float local_400;
  uint local_3fc;
  undefined1 local_3f8 [8];
  void *pvStack_3f0;
  undefined1 local_3e8 [16];
  ulong local_3d0;
  int local_3c8;
  float local_3c4;
  long local_3c0;
  stbtt_fontinfo_conflict *local_3b8;
  undefined8 *local_3b0;
  long local_3a8;
  void *pvStack_3a0;
  uchar *local_390;
  ulong local_388;
  ulong local_380;
  long local_378;
  float *local_370;
  int local_368;
  uint local_364;
  uint local_360;
  float local_35c;
  float local_358;
  int local_354;
  int local_350;
  int local_34c;
  undefined1 local_348 [16];
  stbrp_context_conflict *local_330;
  float *local_328;
  ulong local_320;
  ulong local_318;
  size_t local_310;
  ImFontConfig_conflict *local_308;
  long local_300;
  size_t local_2f8;
  size_t local_2f0;
  uchar *local_2e8;
  long local_2e0;
  short *local_2d8;
  long local_2d0;
  stbtt__edge *local_2c8;
  int local_2c0;
  int local_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  stbtt__buf local_238 [32];
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined4 uVar170;
  undefined6 uVar171;
  undefined8 uVar172;
  undefined1 auVar173 [12];
  undefined1 auVar174 [14];
  undefined1 auVar176 [16];
  undefined4 uVar189;
  undefined6 uVar190;
  undefined8 uVar191;
  undefined1 auVar192 [12];
  undefined1 auVar193 [14];
  undefined1 auVar197 [16];
  
  local_3e8._8_8_ = local_3e8._0_8_;
  local_498._8_8_ = local_498._0_8_;
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0x929,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  local_4d8 = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar8 = (atlas->ConfigData).Size;
  lVar91 = (long)(int)uVar8;
  if (0 < lVar91) {
    uVar78 = 8;
    if (8 < uVar8) {
      uVar78 = (ulong)uVar8;
    }
    local_4d8 = ImGui::MemAlloc(uVar78 * 0x110);
  }
  uVar112 = (atlas->Fonts).Size;
  iVar76 = (int)uVar112 >> 0x1f;
  if ((int)uVar112 < 1) {
    local_498._0_8_ = (void *)0x0;
  }
  else {
    uVar78 = 8;
    if (8 < uVar112) {
      uVar78 = (ulong)uVar112;
    }
    local_498._0_8_ = ImGui::MemAlloc(uVar78 << 5);
  }
  local_310 = lVar91 * 0x110;
  memset(local_4d8,0,local_310);
  local_3e8._0_8_ = CONCAT44(iVar76,uVar112) << 5;
  memset((void *)local_498._0_8_,0,local_3e8._0_8_);
  local_478 = (ImFontAtlas_conflict *)atlas;
  if (0 < (atlas->ConfigData).Size) {
    uVar78 = 0;
    if (0 < (int)uVar8) {
      uVar78 = (ulong)uVar8;
    }
    local_348._0_8_ = uVar78;
    lVar110 = 0;
    do {
      if (lVar110 == local_348._0_8_) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_001cca67;
      }
      pIVar100 = (local_478->ConfigData).Data;
      pIVar9 = pIVar100[lVar110].DstFont;
      if ((pIVar9 == (ImFont *)0x0) ||
         (pIVar9->ContainerAtlas != local_478 &&
          pIVar9->ContainerAtlas != (ImFontAtlas_conflict *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                      ,0x941,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)local_4d8 + lVar110 * 0x110 + 0xe0) = 0xffffffff;
      uVar78 = (ulong)(local_478->Fonts).Size;
      if ((long)uVar78 < 1) {
LAB_001ccaaf:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                      ,0x94a,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar100 = pIVar100 + lVar110;
      uVar94 = 0;
      while (pIVar10 = (local_478->Fonts).Data[uVar94], pIVar9 != pIVar10) {
        uVar94 = uVar94 + 1;
        if ((uVar78 <= uVar94) || (pIVar9 == pIVar10)) goto LAB_001ccaaf;
      }
      *(int *)((long)local_4d8 + lVar110 * 0x110 + 0xe0) = (int)uVar94;
      pbVar115 = (byte *)pIVar100->FontData;
      wVar97 = pIVar100->FontNo;
      bVar118 = *pbVar115;
      local_450 = pIVar100;
      if (bVar118 < 0x4f) {
        if (bVar118 == 0) {
          if (pbVar115[1] != 1) goto LAB_001ccb45;
        }
        else if ((bVar118 != 0x31) || (pbVar115[1] != 0)) goto LAB_001ccb45;
        if ((pbVar115[2] != 0) || (pbVar115[3] != 0)) goto LAB_001ccb45;
LAB_001c95a6:
        sVar74 = -(uint)(wVar97 != L'\0');
      }
      else {
        if (bVar118 == 0x4f) {
          if (((pbVar115[1] != 0x54) || (pbVar115[2] != 0x54)) || (pbVar115[3] != 0x4f))
          goto LAB_001ccb45;
          goto LAB_001c95a6;
        }
        if (bVar118 != 0x74) goto LAB_001ccb45;
        bVar118 = pbVar115[1];
        if (bVar118 == 0x72) {
          if ((pbVar115[2] != 0x75) || (pbVar115[3] != 0x65)) goto LAB_001ccb45;
          goto LAB_001c95a6;
        }
        if (bVar118 != 0x74) {
          if (((bVar118 != 0x79) || (pbVar115[2] != 0x70)) || (pbVar115[3] != 0x31))
          goto LAB_001ccb45;
          goto LAB_001c95a6;
        }
        if ((pbVar115[2] != 99) || (pbVar115[3] != 0x66)) goto LAB_001ccb45;
        uVar75 = *(uint *)(pbVar115 + 4);
        uVar75 = uVar75 >> 0x18 | (uVar75 & 0xff0000) >> 8 | (uVar75 & 0xff00) << 8 | uVar75 << 0x18
        ;
        if (((uVar75 != 0x20000) && (uVar75 != 0x10000)) ||
           (uVar75 = *(uint *)(pbVar115 + 8),
           (int)(uVar75 >> 0x18 | (uVar75 & 0xff0000) >> 8 | (uVar75 & 0xff00) << 8 | uVar75 << 0x18
                ) <= wVar97)) goto LAB_001ccb45;
        uVar75 = *(uint *)(pbVar115 + (long)wVar97 * 4 + 0xc);
        sVar74 = uVar75 >> 0x18 | (uVar75 & 0xff0000) >> 8 | (uVar75 & 0xff00) << 8 | uVar75 << 0x18
        ;
      }
      if ((int)sVar74 < 0) {
LAB_001ccb45:
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                      ,0x94f,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(byte **)((long)local_4d8 + lVar110 * 0x110 + 8) = pbVar115;
      *(stbtt_uint32 *)((long)local_4d8 + lVar110 * 0x110 + 0x10) = sVar74;
      *(undefined8 *)((long)local_4d8 + lVar110 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)local_4d8 + lVar110 * 0x110 + 0x48) = 0;
      sVar67 = stbtt__find_table(pbVar115,sVar74,"cmap");
      sVar68 = stbtt__find_table(pbVar115,sVar74,"loca");
      *(stbtt_uint32 *)((long)local_4d8 + lVar110 * 0x110 + 0x18) = sVar68;
      sVar69 = stbtt__find_table(pbVar115,sVar74,"head");
      *(stbtt_uint32 *)((long)local_4d8 + lVar110 * 0x110 + 0x1c) = sVar69;
      sVar70 = stbtt__find_table(pbVar115,sVar74,"glyf");
      *(stbtt_uint32 *)((long)local_4d8 + lVar110 * 0x110 + 0x20) = sVar70;
      sVar71 = stbtt__find_table(pbVar115,sVar74,"hhea");
      *(stbtt_uint32 *)((long)local_4d8 + lVar110 * 0x110 + 0x24) = sVar71;
      sVar72 = stbtt__find_table(pbVar115,sVar74,"hmtx");
      *(stbtt_uint32 *)((long)local_4d8 + lVar110 * 0x110 + 0x28) = sVar72;
      sVar73 = stbtt__find_table(pbVar115,sVar74,"kern");
      *(stbtt_uint32 *)((long)local_4d8 + lVar110 * 0x110 + 0x2c) = sVar73;
      local_488._0_4_ = sVar74;
      sVar74 = stbtt__find_table(pbVar115,sVar74,"GPOS");
      *(stbtt_uint32 *)((long)local_4d8 + lVar110 * 0x110 + 0x30) = sVar74;
      if ((((sVar67 == 0) || (sVar69 == 0)) || (sVar71 == 0)) || (sVar72 == 0)) {
LAB_001c9dbf:
        if ((void *)local_498._0_8_ != (void *)0x0) {
          ImGui::MemFree((void *)local_498._0_8_);
        }
        if (local_4d8 != (void *)0x0) {
          ImGui::MemFree(local_4d8);
        }
        return false;
      }
      if (sVar70 == 0) {
        local_3a8 = CONCAT44(local_3a8._4_4_,2);
        local_448 = (undefined1  [8])((ulong)local_448 & 0xffffffff00000000);
        local_410._0_4_ = 0;
        local_49c = 0;
        sVar74 = stbtt__find_table(pbVar115,local_488._0_4_,"CFF ");
        if (sVar74 == 0) goto LAB_001c9dbf;
        *(undefined8 *)((long)local_4d8 + lVar110 * 0x110 + 0x90) = 0;
        *(undefined8 *)((long)local_4d8 + lVar110 * 0x110 + 0x98) = 0;
        *(undefined8 *)((long)local_4d8 + lVar110 * 0x110 + 0x80) = 0;
        *(undefined8 *)((long)local_4d8 + lVar110 * 0x110 + 0x88) = 0;
        *(byte **)((long)local_4d8 + lVar110 * 0x110 + 0x40) = pbVar115 + sVar74;
        *(undefined8 *)((long)local_4d8 + lVar110 * 0x110 + 0x48) = 0x2000000000000000;
        local_238[0].data = *(uchar **)((long)local_4d8 + lVar110 * 0x110 + 0x40);
        local_238[0]._8_8_ = *(undefined8 *)((long)local_4d8 + lVar110 * 0x110 + 0x48);
        if (local_238[0].cursor < -2) {
LAB_001ccc2e:
          __assert_fail("!(o > b->size || o < 0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                        ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
        }
        uVar75 = local_238[0].cursor + 2;
        if (local_238[0].size < (int)uVar75) goto LAB_001ccc2e;
        uVar116 = 0;
        if ((int)uVar75 < local_238[0].size) {
          uVar116 = (uint)local_238[0].data[uVar75];
        }
        if (local_238[0].size < (int)uVar116) goto LAB_001ccc2e;
        local_238[0].cursor = uVar116;
        stbtt__cff_get_index(local_238);
        sVar205 = stbtt__cff_get_index(local_238);
        _local_3f8 = stbtt__cff_index_get(sVar205,0);
        stbtt__cff_get_index(local_238);
        sVar205 = stbtt__cff_get_index(local_238);
        *(stbtt__buf *)((long)local_4d8 + lVar110 * 0x110 + 0x60) = sVar205;
        stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x11,1,(stbtt_uint32 *)local_448);
        stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x106,1,(stbtt_uint32 *)&local_3a8);
        stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x124,1,(stbtt_uint32 *)&local_410);
        stbtt__dict_get_ints((stbtt__buf *)local_3f8,0x125,1,&local_49c);
        uVar172 = local_238[0]._8_8_;
        sVar205._4_12_ = in_stack_fffffffffffffb0c;
        sVar205.data._0_4_ = in_stack_fffffffffffffb08;
        fontdict.data._4_4_ = in_stack_fffffffffffffb34;
        fontdict.data._0_4_ = sVar70;
        fontdict.cursor = uVar112;
        fontdict.size = iVar76;
        sVar205 = stbtt__get_subrs(sVar205,fontdict);
        sVar74 = local_49c;
        *(stbtt__buf *)((long)local_4d8 + lVar110 * 0x110 + 0x70) = sVar205;
        if (((stbtt_uint32)local_3a8 != 2) || (uVar170 = local_448._0_4_, local_448._0_4_ == 0))
        goto LAB_001c9dbf;
        iVar93 = SUB84(uVar172,4);
        if ((stbtt_uint32)local_410 != 0) {
          uVar78 = (ulong)local_49c;
          if (uVar78 == 0) goto LAB_001c9dbf;
          if (((int)(stbtt_uint32)local_410 < 0) ||
             (SUB84(uVar172,4) < (int)(stbtt_uint32)local_410)) goto LAB_001ccc2e;
          local_238[0].cursor = (stbtt_uint32)local_410;
          sVar205 = stbtt__cff_get_index(local_238);
          *(stbtt__buf *)((long)local_4d8 + lVar110 * 0x110 + 0x80) = sVar205;
          puVar82 = local_238[0].data + uVar78;
          lVar117 = (ulong)(local_238[0].size - sVar74) << 0x20;
          if ((int)(local_238[0].size - sVar74 | sVar74) < 0 || local_238[0].size < (int)sVar74) {
            puVar82 = (uchar *)0x0;
            lVar117 = 0;
          }
          *(uchar **)((long)local_4d8 + lVar110 * 0x110 + 0x90) = puVar82;
          *(long *)((long)local_4d8 + lVar110 * 0x110 + 0x98) = lVar117;
          iVar93 = local_238[0].size;
        }
        if (((int)uVar170 < 0) || (iVar93 < (int)uVar170)) goto LAB_001ccc2e;
        local_238[0].cursor = uVar170;
        sVar205 = stbtt__cff_get_index(local_238);
        *(stbtt__buf *)((long)local_4d8 + lVar110 * 0x110 + 0x50) = sVar205;
      }
      else if (sVar68 == 0) goto LAB_001c9dbf;
      sVar74 = stbtt__find_table(pbVar115,local_488._0_4_,"maxp");
      if (sVar74 == 0) {
        uVar75 = 0xffff;
      }
      else {
        uVar75 = (uint)(ushort)(*(ushort *)(pbVar115 + (ulong)sVar74 + 4) << 8 |
                               *(ushort *)(pbVar115 + (ulong)sVar74 + 4) >> 8);
      }
      *(uint *)((long)local_4d8 + lVar110 * 0x110 + 0x14) = uVar75;
      uVar64 = *(ushort *)(pbVar115 + (ulong)sVar67 + 2) << 8 |
               *(ushort *)(pbVar115 + (ulong)sVar67 + 2) >> 8;
      *(undefined4 *)((long)local_4d8 + lVar110 * 0x110 + 0x34) = 0;
      if (uVar64 == 0) goto LAB_001c9dbf;
      uVar75 = sVar67 + 4;
      uVar78 = (ulong)uVar64;
      iVar93 = 0;
      do {
        uVar64 = *(ushort *)(pbVar115 + uVar75) << 8 | *(ushort *)(pbVar115 + uVar75) >> 8;
        if ((uVar64 == 0) ||
           ((uVar64 == 3 &&
            ((uVar64 = *(ushort *)(pbVar115 + (ulong)uVar75 + 2) << 8 |
                       *(ushort *)(pbVar115 + (ulong)uVar75 + 2) >> 8, uVar64 == 10 || (uVar64 == 1)
             ))))) {
          uVar116 = *(uint *)(pbVar115 + (ulong)uVar75 + 4);
          iVar93 = (uVar116 >> 0x18 | (uVar116 & 0xff0000) >> 8 | (uVar116 & 0xff00) << 8 |
                   uVar116 << 0x18) + sVar67;
          *(int *)((long)local_4d8 + lVar110 * 0x110 + 0x34) = iVar93;
        }
        uVar75 = uVar75 + 8;
        uVar78 = uVar78 - 1;
      } while (uVar78 != 0);
      if (iVar93 == 0) goto LAB_001c9dbf;
      *(uint *)((long)local_4d8 + lVar110 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (pbVar115 +
                           (long)*(int *)((long)local_4d8 + lVar110 * 0x110 + 0x1c) + 0x32) << 8 |
                         *(ushort *)
                          (pbVar115 +
                          (long)*(int *)((long)local_4d8 + lVar110 * 0x110 + 0x1c) + 0x32) >> 8);
      iVar93 = *(int *)((long)local_4d8 + lVar110 * 0x110 + 0xe0);
      if (((long)iVar93 < 0) || ((int)uVar112 <= iVar93)) goto LAB_001ccba2;
      pIVar92 = local_450->GlyphRanges;
      if (pIVar92 == (ImWchar *)0x0) {
        pIVar92 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)local_4d8 + lVar110 * 0x110 + 0xd8) = pIVar92;
      IVar6 = *pIVar92;
      while (IVar6 != 0) {
        uVar64 = pIVar92[1];
        if (uVar64 == 0) break;
        uVar75 = *(uint *)((long)local_4d8 + lVar110 * 0x110 + 0xe4);
        uVar116 = (uint)uVar64;
        if ((int)(uint)uVar64 < (int)uVar75) {
          uVar116 = uVar75;
        }
        *(uint *)((long)local_4d8 + lVar110 * 0x110 + 0xe4) = uVar116;
        IVar6 = pIVar92[2];
        pIVar92 = pIVar92 + 2;
      }
      piVar79 = (int *)((long)iVar93 * 0x20 + local_498._0_8_);
      *piVar79 = *piVar79 + 1;
      iVar93 = *(int *)((long)local_4d8 + lVar110 * 0x110 + 0xe4);
      if (iVar93 < piVar79[1]) {
        iVar93 = piVar79[1];
      }
      piVar79[1] = iVar93;
      lVar110 = lVar110 + 1;
    } while (lVar110 < (local_478->ConfigData).Size);
  }
  auVar83 = (undefined1  [8])0;
  if (0 < (int)uVar8) {
    lVar110 = 0;
    auVar83 = (undefined1  [8])0;
    do {
      lVar117 = lVar110 * 0x110;
      iVar76 = *(int *)((long)local_4d8 + lVar117 + 0xe0);
      if (((long)iVar76 < 0) || ((int)uVar112 <= iVar76)) goto LAB_001ccba2;
      local_488 = auVar83;
      this_00 = (ImBitVector *)((long)local_4d8 + lVar117 + 0xf0);
      ImBitVector::Create(this_00,*(int *)((long)local_4d8 + lVar117 + 0xe4) + 1);
      lVar98 = (long)iVar76 * 0x20 + local_498._0_8_;
      this = (ImBitVector *)(lVar98 + 0x10);
      if (*(int *)(lVar98 + 0x10) == 0) {
        ImBitVector::Create(this,*(int *)(lVar98 + 4) + 1);
      }
      puVar103 = *(ushort **)((long)local_4d8 + lVar117 + 0xd8);
      uVar64 = *puVar103;
      for (; (uVar64 != 0 && (puVar103[1] != 0)); puVar103 = puVar103 + 2) {
        if (uVar64 <= puVar103[1]) {
          uVar75 = (uint)uVar64;
          do {
            bVar63 = ImBitVector::TestBit(this,uVar75);
            if ((!bVar63) &&
               (iVar76 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo_conflict **)((long)local_4d8 + lVar117 + 8),
                                    *(int *)((long)local_4d8 + lVar117 + 0x34)), iVar76 != 0)) {
              piVar79 = (int *)((long)local_4d8 + lVar117 + 0xe8);
              *piVar79 = *piVar79 + 1;
              *(int *)(lVar98 + 8) = *(int *)(lVar98 + 8) + 1;
              ImBitVector::SetBit(this_00,uVar75);
              ImBitVector::SetBit(this,uVar75);
              auVar131 = _local_488;
              iVar76 = local_488._0_4_;
              local_488._4_4_ = 0;
              local_488._0_4_ = iVar76 + 1;
              _fStack_480 = auVar131._8_8_;
            }
            bVar63 = uVar75 < puVar103[1];
            uVar75 = uVar75 + 1;
          } while (bVar63);
        }
        uVar64 = puVar103[2];
      }
      lVar110 = lVar110 + 1;
      auVar83 = local_488;
    } while (lVar110 != lVar91);
    if (0 < (int)uVar8) {
      lVar110 = 0;
      do {
        lVar117 = lVar110 * 0x110;
        iVar76 = *(int *)((long)local_4d8 + lVar117 + 0xe8);
        if (*(int *)((long)local_4d8 + lVar117 + 0x104) < iVar76) {
          pvVar80 = ImGui::MemAlloc((long)iVar76 << 2);
          pvVar81 = *(void **)((long)local_4d8 + lVar117 + 0x108);
          if (pvVar81 != (void *)0x0) {
            memcpy(pvVar80,pvVar81,(long)*(int *)((long)local_4d8 + lVar117 + 0x100) << 2);
            ImGui::MemFree(*(void **)((long)local_4d8 + lVar117 + 0x108));
          }
          *(void **)((long)local_4d8 + lVar117 + 0x108) = pvVar80;
          *(int *)((long)local_4d8 + lVar117 + 0x104) = iVar76;
        }
        lVar98 = (long)*(int *)((long)local_4d8 + lVar117 + 0xf0);
        ptr_00 = *(uint **)((long)local_4d8 + lVar117 + 0xf8);
        if (0 < lVar98) {
          puVar206 = ptr_00 + lVar98;
          iVar76 = 0;
          do {
            uVar75 = *ptr_00;
            if (uVar75 != 0) {
              uVar116 = 0;
              do {
                if ((uVar75 >> (uVar116 & 0x1f) & 1) != 0) {
                  iVar93 = *(int *)((long)local_4d8 + lVar117 + 0x100);
                  if (iVar93 == *(int *)((long)local_4d8 + lVar117 + 0x104)) {
                    if (iVar93 == 0) {
                      iVar77 = 8;
                    }
                    else {
                      iVar77 = iVar93 / 2 + iVar93;
                    }
                    iVar158 = iVar93 + 1;
                    if (iVar93 + 1 < iVar77) {
                      iVar158 = iVar77;
                    }
                    pvVar81 = ImGui::MemAlloc((long)iVar158 << 2);
                    pvVar80 = *(void **)((long)local_4d8 + lVar117 + 0x108);
                    if (pvVar80 != (void *)0x0) {
                      memcpy(pvVar81,pvVar80,(long)*(int *)((long)local_4d8 + lVar117 + 0x100) << 2)
                      ;
                      ImGui::MemFree(*(void **)((long)local_4d8 + lVar117 + 0x108));
                    }
                    *(void **)((long)local_4d8 + lVar117 + 0x108) = pvVar81;
                    *(int *)((long)local_4d8 + lVar117 + 0x104) = iVar158;
                    iVar93 = *(int *)((long)local_4d8 + lVar117 + 0x100);
                  }
                  else {
                    pvVar81 = *(void **)((long)local_4d8 + lVar117 + 0x108);
                  }
                  *(uint *)((long)pvVar81 + (long)iVar93 * 4) = iVar76 + uVar116;
                  piVar79 = (int *)((long)local_4d8 + lVar117 + 0x100);
                  *piVar79 = *piVar79 + 1;
                }
                uVar116 = uVar116 + 1;
              } while (uVar116 != 0x20);
            }
            ptr_00 = ptr_00 + 1;
            iVar76 = iVar76 + 0x20;
          } while (ptr_00 < puVar206);
          ptr_00 = *(uint **)((long)local_4d8 + lVar117 + 0xf8);
        }
        if (ptr_00 != (uint *)0x0) {
          *(undefined8 *)((long)local_4d8 + lVar117 + 0xf0) = 0;
          ImGui::MemFree(ptr_00);
          *(undefined8 *)((long)local_4d8 + lVar117 + 0xf8) = 0;
        }
        if (*(int *)((long)local_4d8 + lVar117 + 0x100) !=
            *(int *)((long)local_4d8 + lVar117 + 0xe8)) {
          __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                        ,0x97e,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        lVar110 = lVar110 + 1;
      } while (lVar110 != lVar91);
      auVar83 = local_488;
    }
  }
  atlas_00 = local_478;
  uVar172 = local_498._0_8_;
  if ((int)uVar112 < 1) {
    if (local_498._0_8_ != 0) goto LAB_001c9e33;
  }
  else {
    lVar110 = 0;
    do {
      pvVar81 = *(void **)(uVar172 + 0x18 + lVar110);
      if (pvVar81 != (void *)0x0) {
        *(undefined8 *)(uVar172 + 0x10 + lVar110) = 0;
        ImGui::MemFree(pvVar81);
        *(undefined8 *)(uVar172 + 0x18 + lVar110) = 0;
      }
      lVar110 = lVar110 + 0x20;
    } while (local_3e8._0_8_ != lVar110);
LAB_001c9e33:
    ImGui::MemFree((void *)local_498._0_8_);
  }
  _local_3f8 = (stbtt__buf)ZEXT816(0);
  local_3a8 = 0;
  pvStack_3a0 = (void *)0x0;
  uVar112 = SUB84(auVar83,0);
  if ((int)uVar112 < 1) {
    local_3f8._0_4_ = uVar112;
    pvVar81 = (void *)0x0;
  }
  else {
    uVar78 = 8;
    if (8 < uVar112) {
      uVar78 = (ulong)auVar83 & 0xffffffff;
    }
    pvVar81 = ImGui::MemAlloc(uVar78 << 4);
    pvStack_3f0 = pvVar81;
    local_3f8._4_4_ = (int)uVar78;
    uVar78 = 8;
    if (8 < uVar112) {
      uVar78 = (ulong)auVar83 & 0xffffffff;
    }
    local_3f8._0_4_ = uVar112;
    pvStack_3a0 = ImGui::MemAlloc(uVar78 * 0x1c);
    local_3a8 = uVar78 << 0x20;
  }
  pvVar80 = pvStack_3a0;
  local_3a8 = CONCAT44(local_3a8._4_4_,uVar112);
  iVar76 = 0;
  memset(pvVar81,0,(long)(int)(uVar112 << 4));
  local_498._0_8_ = pvVar80;
  memset(pvVar80,0,(long)(int)(uVar112 * 0x1c));
  if ((int)uVar8 < 1) {
    fVar130 = 0.0;
  }
  else {
    lVar110 = 0;
    uVar78 = 0;
    uVar112 = 0;
    local_488 = auVar83;
    lVar117 = local_498._0_8_;
    do {
      iVar77 = (int)uVar78;
      iVar93 = *(int *)((long)local_4d8 + lVar110 * 0x110 + 0xe8);
      if (iVar93 != 0) {
        if ((iVar77 < 0) || (SUB84(auVar83,0) <= iVar77)) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_001cca67;
        }
        psVar99 = (stbtt_fontinfo_conflict *)(lVar110 * 0x110 + (long)local_4d8);
        *(void **)&psVar99[1].hmtx = (void *)(uVar78 * 0x10 + (long)pvVar81);
        if (((int)uVar112 < 0) || (SUB84(auVar83,0) <= (int)uVar112)) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_001cca67;
        }
        lVar98 = (ulong)uVar112 * 0x1c + lVar117;
        *(long *)&psVar99[1].gpos = lVar98;
        if ((atlas_00->ConfigData).Size <= lVar110) goto LAB_001ccb0c;
        pIVar100 = (atlas_00->ConfigData).Data;
        fVar130 = pIVar100[lVar110].SizePixels;
        *(float *)&psVar99[1].userdata = fVar130;
        *(undefined4 *)((long)&psVar99[1].userdata + 4) = 0;
        psVar99[1].data = *(uchar **)&psVar99[1].gsubrs.cursor;
        uVar75 = *(uint *)&psVar99[1].gsubrs.data;
        uVar94 = (ulong)uVar75;
        psVar99[1].fontstart = uVar75;
        *(long *)&psVar99[1].loca = lVar98;
        *(char *)&psVar99[1].glyf = (char)pIVar100[lVar110].OversampleH;
        *(char *)((long)&psVar99[1].glyf + 1) = (char)pIVar100[lVar110].OversampleV;
        if (fVar130 <= 0.0) {
          fVar130 = -fVar130;
          uVar116 = (uint)(ushort)(*(ushort *)(psVar99->data + (long)psVar99->head + 0x12) << 8 |
                                  *(ushort *)(psVar99->data + (long)psVar99->head + 0x12) >> 8);
        }
        else {
          puVar82 = psVar99->data;
          lVar117 = (long)psVar99->hhea;
          uVar116 = ((int)(short)((ushort)puVar82[lVar117 + 4] << 8) | (uint)puVar82[lVar117 + 5]) -
                    ((int)(short)((ushort)puVar82[lVar117 + 6] << 8) | (uint)puVar82[lVar117 + 7]);
          lVar117 = local_498._0_8_;
        }
        fVar130 = fVar130 / (float)(int)uVar116;
        uVar78 = (ulong)(uint)(iVar77 + iVar93);
        uVar112 = uVar112 + iVar93;
        if (0 < (int)uVar75) {
          local_3e8._0_4_ = iVar77 + iVar93;
          uVar170 = (undefined4)lVar110;
          uVar189 = (undefined4)((ulong)lVar110 >> 0x20);
          wVar97 = atlas_00->TexGlyphPadding;
          lVar98 = 6;
          lVar117 = 0;
          do {
            if ((int)uVar94 <= lVar117) goto LAB_001cca52;
            iVar93 = stbtt_FindGlyphIndex
                               ((stbtt_fontinfo_conflict *)psVar99->data,psVar99->index_map);
            if (iVar93 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                            ,0x9ad,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar99,iVar93,(float)pIVar100[lVar110].OversampleH * fVar130,
                       (float)pIVar100[lVar110].OversampleV * fVar130,fVar130,in_XMM3._0_4_,
                       (int *)local_238,(int *)local_448,(int *)&local_410,(int *)&local_49c);
            uVar75 = (pIVar100[lVar110].OversampleH +
                     (((stbtt_uint32)local_410 + wVar97) - (int)local_238[0].data)) - 1;
            lVar95 = *(long *)&psVar99[1].hmtx;
            *(short *)(lVar95 + -2 + lVar98) = (short)uVar75;
            uVar116 = (pIVar100[lVar110].OversampleV + ((local_49c + wVar97) - local_448._0_4_)) - 1
            ;
            *(short *)(lVar95 + lVar98) = (short)uVar116;
            iVar76 = iVar76 + (uVar116 & 0xffff) * (uVar75 & 0xffff);
            lVar117 = lVar117 + 1;
            uVar94 = (ulong)*(int *)&psVar99[1].gsubrs.data;
            lVar98 = lVar98 + 0x10;
          } while (lVar117 < (long)uVar94);
          lVar110 = CONCAT44(uVar189,uVar170);
          uVar78 = (ulong)(uint)local_3e8._0_4_;
          lVar117 = local_498._0_8_;
          atlas_00 = local_478;
          auVar83 = local_488;
        }
      }
      lVar110 = lVar110 + 1;
    } while (lVar110 != lVar91);
    fVar130 = (float)iVar76;
  }
  atlas_00->TexHeight = L'\0';
  fVar102 = (float)atlas_00->TexDesiredWidth;
  if ((int)fVar102 < L'\x01') {
    iVar76 = (int)SQRT(fVar130);
    fVar102 = 5.73972e-42;
    if ((iVar76 < 0xb33) && (fVar102 = 2.86986e-42, iVar76 < 0x599)) {
      fVar102 = (float)((uint)(0x2cb < iVar76) * 0x200 + L'Ȁ');
    }
  }
  atlas_00->TexWidth = (wchar_t)fVar102;
  wVar97 = atlas_00->TexGlyphPadding;
  ptr = (stbrp_context_conflict *)ImGui::MemAlloc(0x48);
  uVar112 = (int)fVar102 - wVar97;
  local_440 = (stbrp_node_conflict *)ImGui::MemAlloc((long)(int)uVar112 << 4);
  auVar202 = _DAT_0020dbf0;
  auVar131 = _DAT_001fd020;
  if ((ptr == (stbrp_context_conflict *)0x0) || (local_440 == (stbrp_node_conflict *)0x0)) {
    if (ptr != (stbrp_context_conflict *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (local_440 != (stbrp_node_conflict *)0x0) {
      ImGui::MemFree(local_440);
    }
    local_440 = (stbrp_node_conflict *)0x0;
    wVar97 = L'\0';
    fVar102 = 0.0;
    ptr = (stbrp_context_conflict *)0x0;
  }
  else {
    if ((wVar97 < L'\xffff8001') || (0xffff < (int)uVar112)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar78 = (ulong)(uVar112 - 1);
    if ((int)uVar112 < 2) {
      uVar78 = 0;
    }
    else {
      uVar94 = (ulong)(uVar112 & 0x7ffffffe);
      lVar110 = uVar78 - 1;
      auVar119._8_4_ = (int)lVar110;
      auVar119._0_8_ = lVar110;
      auVar119._12_4_ = (int)((ulong)lVar110 >> 0x20);
      ppsVar107 = &local_440[1].next;
      auVar119 = auVar119 ^ _DAT_001fd020;
      auVar144._8_4_ = 0xffffffff;
      auVar144._0_8_ = 0xffffffffffffffff;
      auVar144._12_4_ = 0xffffffff;
      auVar133 = _DAT_001fe220;
      do {
        auVar149 = auVar133 ^ auVar131;
        auVar160._0_4_ = -(uint)(auVar119._0_4_ < auVar149._0_4_);
        auVar160._4_4_ = -(uint)(auVar119._4_4_ < auVar149._4_4_);
        auVar160._8_4_ = -(uint)(auVar119._8_4_ < auVar149._8_4_);
        auVar160._12_4_ = -(uint)(auVar119._12_4_ < auVar149._12_4_);
        auVar150._4_4_ = -(uint)(auVar149._4_4_ == auVar119._4_4_);
        auVar150._12_4_ = -(uint)(auVar149._12_4_ == auVar119._12_4_);
        auVar150._0_4_ = auVar150._4_4_;
        auVar150._8_4_ = auVar150._12_4_;
        auVar149._4_4_ = auVar160._4_4_;
        auVar149._0_4_ = auVar160._4_4_;
        auVar149._8_4_ = auVar160._12_4_;
        auVar149._12_4_ = auVar160._12_4_;
        auVar149 = auVar149 | auVar150 & auVar160;
        lVar110 = auVar133._8_8_;
        if ((~auVar149._0_4_ & 1) != 0) {
          ppsVar107[-2] = local_440 + auVar133._0_8_ + 1;
        }
        if (((auVar149 ^ auVar144) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar107 = local_440 + (lVar110 - auVar144._8_8_);
        }
        auVar133._0_8_ = auVar133._0_8_ + auVar202._0_8_;
        auVar133._8_8_ = lVar110 + auVar202._8_8_;
        ppsVar107 = ppsVar107 + 4;
        uVar94 = uVar94 - 2;
      } while (uVar94 != 0);
    }
    local_440[uVar78].next = (stbrp_node_conflict *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = local_440;
    ptr->active_head = ptr->extra;
    ptr->width = uVar112;
    ptr->height = 0x8000 - wVar97;
    ptr->num_nodes = uVar112;
    ptr->align = (int)((uVar112 - 1) + uVar112) / (int)uVar112;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord_conflict)uVar112;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node_conflict *)0x0;
  }
  local_330 = ptr;
  ImFontAtlasBuildPackCustomRects((ImFontAtlas *)atlas_00,ptr);
  if (0 < (int)uVar8) {
    lVar110 = 0;
    do {
      lVar117 = lVar110 * 0x110;
      iVar76 = *(int *)((long)local_4d8 + lVar117 + 0xe8);
      if (iVar76 != 0) {
        stbrp_pack_rects(local_330,*(stbrp_rect_conflict **)((long)local_4d8 + lVar117 + 200),iVar76
                        );
        lVar98 = (long)*(int *)((long)local_4d8 + lVar117 + 0xe8);
        if (0 < lVar98) {
          lVar117 = *(long *)((long)local_4d8 + lVar117 + 200);
          lVar95 = 0;
          do {
            if (*(int *)(lVar117 + 0xc + lVar95) != 0) {
              wVar109 = (uint)*(ushort *)(lVar117 + 6 + lVar95) +
                        (uint)*(ushort *)(lVar117 + 10 + lVar95);
              if (wVar109 < atlas_00->TexHeight) {
                wVar109 = atlas_00->TexHeight;
              }
              atlas_00->TexHeight = wVar109;
            }
            lVar95 = lVar95 + 0x10;
          } while (lVar98 * 0x10 != lVar95);
        }
      }
      lVar110 = lVar110 + 1;
    } while (lVar110 != lVar91);
  }
  wVar109 = atlas_00->TexHeight;
  if ((atlas_00->Flags & 1) == 0) {
    uVar112 = wVar109 + L'\xffffffff' >> 1 | wVar109 + L'\xffffffff';
    uVar112 = (int)uVar112 >> 2 | uVar112;
    uVar112 = (int)uVar112 >> 4 | uVar112;
    uVar112 = (int)uVar112 >> 8 | uVar112;
    wVar109 = (int)uVar112 >> 0x10 | uVar112;
  }
  wVar109 = wVar109 + L'\x01';
  atlas_00->TexHeight = wVar109;
  auVar131._0_4_ = (float)atlas_00->TexWidth;
  auVar131._4_4_ = (float)wVar109;
  auVar131._8_8_ = 0;
  auVar131 = divps(_DAT_001ff530,auVar131);
  atlas_00->TexUvScale = auVar131._0_8_;
  puVar82 = (uchar *)ImGui::MemAlloc((long)(wVar109 * atlas_00->TexWidth));
  atlas_00->TexPixelsAlpha8 = puVar82;
  local_42c = fVar102;
  memset(puVar82,0,(long)atlas_00->TexHeight * (long)atlas_00->TexWidth);
  if (0 < (int)uVar8) {
    local_390 = atlas_00->TexPixelsAlpha8;
    lVar117 = (long)(int)local_42c;
    local_298 = pshuflw(ZEXT416((uint)wVar97),ZEXT416((uint)wVar97),0);
    lVar110 = 0;
    auVar131 = _DAT_00225ac0;
    do {
      auVar202 = _local_488;
      local_3c0 = lVar110;
      if ((atlas_00->ConfigData).Size <= lVar110) goto LAB_001ccb0c;
      if (*(int *)((long)local_4d8 + lVar110 * 0x110 + 0xe8) != 0) {
        psVar99 = (stbtt_fontinfo_conflict *)(lVar110 * 0x110 + (long)local_4d8);
        fVar130 = *(float *)&psVar99[1].userdata;
        auVar151 = ZEXT416((uint)fVar130);
        if (fVar130 <= 0.0) {
          auVar151._0_4_ = -fVar130;
          auVar151._4_4_ = 0x80000000;
          auVar151._8_4_ = 0x80000000;
          auVar151._12_4_ = 0x80000000;
          uVar112 = (uint)(ushort)(*(ushort *)(psVar99->data + (long)psVar99->head + 0x12) << 8 |
                                  *(ushort *)(psVar99->data + (long)psVar99->head + 0x12) >> 8);
        }
        else {
          puVar82 = psVar99->data;
          lVar110 = (long)psVar99->hhea;
          uVar112 = ((int)(short)((ushort)puVar82[lVar110 + 4] << 8) | (uint)puVar82[lVar110 + 5]) -
                    ((int)(short)((ushort)puVar82[lVar110 + 6] << 8) | (uint)puVar82[lVar110 + 7]);
        }
        auVar152._4_12_ = auVar151._4_12_;
        auVar152._0_4_ = auVar151._0_4_ / (float)(int)uVar112;
        local_308 = (atlas_00->ConfigData).Data;
        iVar76 = psVar99[1].fontstart;
        if (0 < iVar76) {
          lVar110._0_4_ = psVar99[1].hmtx;
          lVar110._4_4_ = psVar99[1].kern;
          uVar78._0_4_ = psVar99[1].glyf;
          uVar78._4_4_ = psVar99[1].hhea;
          auVar37._8_6_ = 0;
          auVar37._0_8_ = uVar78;
          auVar37[0xe] = (char)((uint)uVar78._4_4_ >> 0x18);
          auVar39._8_4_ = 0;
          auVar39._0_8_ = uVar78;
          auVar39[0xc] = (char)((uint)uVar78._4_4_ >> 0x10);
          auVar39._13_2_ = auVar37._13_2_;
          auVar40._8_4_ = 0;
          auVar40._0_8_ = uVar78;
          auVar40._12_3_ = auVar39._12_3_;
          auVar41._8_2_ = 0;
          auVar41._0_8_ = uVar78;
          auVar41[10] = (char)((uint)uVar78._4_4_ >> 8);
          auVar41._11_4_ = auVar40._11_4_;
          auVar44._8_2_ = 0;
          auVar44._0_8_ = uVar78;
          auVar44._10_5_ = auVar41._10_5_;
          auVar45[8] = (char)uVar78._4_4_;
          auVar45._0_8_ = uVar78;
          auVar45._9_6_ = auVar44._9_6_;
          auVar48._7_8_ = 0;
          auVar48._0_7_ = auVar45._8_7_;
          cVar128 = (char)((uint)(undefined4)uVar78 >> 0x18);
          Var49 = CONCAT81(SUB158(auVar48 << 0x40,7),cVar128);
          auVar55._9_6_ = 0;
          auVar55._0_9_ = Var49;
          cVar126 = (char)((uint)(undefined4)uVar78 >> 0x10);
          auVar46[4] = cVar126;
          auVar46._0_4_ = (undefined4)uVar78;
          auVar46._5_10_ = SUB1510(auVar55 << 0x30,5);
          auVar50._11_4_ = 0;
          auVar50._0_11_ = auVar46._4_11_;
          cVar125 = (char)((uint)(undefined4)uVar78 >> 8);
          auVar51._1_12_ = SUB1512(auVar50 << 0x20,3);
          auVar51[0] = cVar125;
          bVar118 = (byte)(undefined4)uVar78;
          uVar64 = CONCAT11(0,bVar118);
          auVar47._2_13_ = auVar51;
          auVar47._0_2_ = uVar64;
          uVar127 = auVar51._0_2_;
          sVar88 = -auVar46._4_2_;
          sVar129 = (short)Var49;
          sVar66 = -sVar129;
          local_470 = (ulong)uVar127;
          auVar38._10_2_ = 0;
          auVar38._0_10_ = auVar47._0_10_;
          auVar38._12_2_ = sVar129;
          uVar57 = CONCAT42(auVar38._10_4_,auVar46._4_2_);
          auVar52._6_8_ = 0;
          auVar52._0_6_ = uVar57;
          auVar42._4_2_ = uVar127;
          auVar42._0_4_ = auVar47._0_4_;
          auVar42._6_8_ = SUB148(auVar52 << 0x40,6);
          auVar120._0_4_ = (float)uVar64;
          auVar120._4_4_ = (float)auVar42._4_4_;
          auVar120._8_4_ = (float)(int)uVar57;
          auVar120._12_4_ = (float)(auVar38._10_4_ >> 0x10);
          local_268 = divps(_DAT_001ff530,auVar120);
          auVar161[0] = -(bVar118 == 0);
          auVar161[1] = -(bVar118 == 0);
          auVar161[2] = -(bVar118 == 0);
          auVar161[3] = -(bVar118 == 0);
          auVar161[4] = -(cVar125 == '\0');
          auVar161[5] = -(cVar125 == '\0');
          auVar161[6] = -(cVar125 == '\0');
          auVar161[7] = -(cVar125 == '\0');
          auVar161[8] = -(cVar126 == '\0');
          auVar161[9] = -(cVar126 == '\0');
          auVar161[10] = -(cVar126 == '\0');
          auVar161[0xb] = -(cVar126 == '\0');
          auVar161[0xc] = -(cVar128 == '\0');
          auVar161[0xd] = -(cVar128 == '\0');
          auVar161[0xe] = -(cVar128 == '\0');
          auVar161[0xf] = -(cVar128 == '\0');
          Var56 = CONCAT64(CONCAT42(CONCAT22(sVar66,sVar66),sVar88),CONCAT22(sVar88,sVar66));
          auVar53._4_8_ = (long)((unkuint10)Var56 >> 0x10);
          auVar53._2_2_ = 1 - uVar127;
          auVar53._0_2_ = 1 - uVar127;
          auVar132._0_4_ = (float)(int)(short)(1 - uVar64);
          auVar132._4_4_ = (float)(auVar53._0_4_ >> 0x10);
          auVar132._8_4_ = (float)((int)((unkuint10)Var56 >> 0x10) >> 0x10);
          auVar132._12_4_ = (float)(int)sVar66;
          auVar145._0_4_ = auVar152._0_4_ * auVar120._0_4_;
          auVar145._4_4_ = auVar152._0_4_ * auVar120._4_4_;
          auVar145._8_4_ = auVar152._0_4_ * auVar120._8_4_;
          auVar145._12_4_ = auVar152._0_4_ * auVar120._12_4_;
          auVar121._0_4_ = auVar120._0_4_ + auVar120._0_4_;
          auVar121._4_4_ = auVar120._4_4_ + auVar120._4_4_;
          auVar121._8_4_ = auVar120._8_4_ + auVar120._8_4_;
          auVar121._12_4_ = auVar120._12_4_ + auVar120._12_4_;
          auVar133 = divps(auVar132,auVar121);
          fVar130 = auVar145._4_4_;
          if (auVar145._0_4_ <= auVar145._4_4_) {
            fVar130 = auVar145._0_4_;
          }
          local_3c4 = (0.35 / fVar130) * (0.35 / fVar130);
          local_2b8 = auVar145._4_4_;
          fStack_2b4 = auVar145._4_4_;
          fStack_2b0 = auVar145._4_4_;
          fStack_2ac = auVar145._4_4_;
          local_318 = (ulong)((undefined4)uVar78 & 0xff);
          local_320 = (ulong)((uint)(undefined4)uVar78 >> 8 & 0xff);
          local_278._4_4_ = local_268._4_4_;
          local_278._0_4_ = local_278._4_4_;
          local_278._8_4_ = local_278._4_4_;
          local_278._12_4_ = local_278._4_4_;
          local_258 = ~auVar161 & auVar133;
          local_288._4_4_ = SUB164(~auVar161 & auVar133,4);
          local_288._0_4_ = local_288._4_4_;
          local_288._8_4_ = local_288._4_4_;
          local_288._12_4_ = local_288._4_4_;
          local_488._4_4_ = 0;
          local_488._0_4_ = auVar47._0_4_ & 0xff;
          _fStack_480 = auVar202._8_8_;
          local_2a8 = auVar145;
          uVar78 = CONCAT44(auVar145._4_4_,auVar145._0_4_);
          local_248 = uVar78 ^ 0x8000000000000000;
          fStack_240 = auVar145._0_4_;
          fStack_23c = -auVar145._4_4_;
          lVar98 = 0;
          local_3b8 = psVar99;
          local_2e0 = lVar110;
          local_468 = auVar152;
          do {
            if (((*(int *)(lVar110 + 0xc + lVar98 * 0x10) != 0) &&
                (lVar95 = lVar98 * 0x10 + lVar110, *(short *)(lVar95 + 4) != 0)) &&
               (*(short *)(lVar95 + 6) != 0)) {
              local_2d8 = (short *)(lVar98 * 0x1c + *(long *)&psVar99[1].loca);
              local_2d0 = lVar98;
              iVar93 = stbtt_FindGlyphIndex
                                 ((stbtt_fontinfo_conflict *)psVar99->data,psVar99->index_map);
              uVar172 = *(undefined8 *)(lVar95 + 4);
              *(ulong *)(lVar95 + 4) =
                   CONCAT44(CONCAT22((short)((ulong)uVar172 >> 0x30) + local_298._6_2_,
                                     (short)((ulong)uVar172 >> 0x20) + local_298._4_2_),
                            CONCAT22((short)((ulong)uVar172 >> 0x10) - local_298._2_2_,
                                     (short)uVar172 - local_298._0_2_));
              puVar82 = psVar99->data;
              uVar64 = *(ushort *)(puVar82 + (long)psVar99->hhea + 0x22) << 8 |
                       *(ushort *)(puVar82 + (long)psVar99->hhea + 0x22) >> 8;
              iVar76 = psVar99->hmtx;
              lVar110 = (ulong)uVar64 * 4 + (long)iVar76 + -4;
              lVar98 = (ulong)uVar64 * 4 + (long)iVar76 + -3;
              if (iVar93 < (int)(uint)uVar64) {
                lVar110 = (long)(iVar93 * 4) + (long)iVar76;
                lVar98 = (long)(iVar93 * 4) + 1 + (long)iVar76;
              }
              local_364 = (uint)puVar82[lVar98];
              local_360 = (uint)puVar82[lVar110];
              auVar131 = local_298;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar99,iVar93,(float)local_2a8._0_4_,local_2b8,local_298._0_4_,
                         auVar145._0_4_,&local_350,&local_354,&local_2bc,&local_2c0);
              fVar130 = auVar131._0_4_;
              uVar64 = *(ushort *)(lVar95 + 8);
              uVar127 = *(ushort *)(lVar95 + 10);
              local_428 = (ulong)*(ushort *)(lVar95 + 4);
              local_3d0 = (ulong)*(ushort *)(lVar95 + 6);
              local_378 = lVar95;
              uVar112 = stbtt_GetGlyphShape(psVar99,iVar93,(stbtt_vertex **)&local_410);
              uVar75 = ((int)local_428 - local_488._0_4_) + 1;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_3b8,iVar93,(float)local_2a8._0_4_,local_2b8,fVar130,auVar145._0_4_,
                         (int *)&local_49c,&local_34c,(int *)0x0,(int *)0x0);
              local_3fc = uVar75;
              if (uVar75 != 0) {
                iVar76 = ((int)local_3d0 - (int)local_470) + 1;
                if ((iVar76 != 0) && (0 < (int)uVar112)) {
                  local_2e8 = local_390 + (ulong)uVar127 * lVar117 + (ulong)uVar64;
                  local_428 = (ulong)(uint)((int)local_428 - local_488._0_4_);
                  local_3d0 = (ulong)(uint)((int)local_3d0 - (int)local_470);
                  lVar110 = CONCAT44(local_410._4_4_,(stbtt_uint32)local_410);
                  local_498._0_4_ = local_49c;
                  local_404 = local_34c;
                  lVar98 = 0;
                  uVar75 = 0;
                  do {
                    uVar75 = uVar75 + (*(char *)(lVar110 + 0xc + lVar98) == '\x01');
                    lVar98 = lVar98 + 0xe;
                  } while ((ulong)uVar112 * 0xe != lVar98);
                  if ((uVar75 != 0) &&
                     (local_420 = ImGui::MemAlloc((ulong)uVar75 * 4), local_420 != (void *)0x0)) {
                    uVar170 = 0;
                    bVar87 = false;
                    iVar77 = 0;
                    local_450 = (ImFontConfig_conflict *)0x0;
                    iVar93 = 0;
                    bVar63 = true;
                    do {
                      bVar96 = bVar63;
                      if ((bVar87) &&
                         (local_450 = (ImFontConfig_conflict *)ImGui::MemAlloc((long)iVar93 << 3),
                         local_450 == (ImFontConfig_conflict *)0x0)) {
                        ImGui::MemFree((void *)0x0);
                        ImGui::MemFree(local_420);
                        goto LAB_001cb93c;
                      }
                      local_238[0].data = (uchar *)((ulong)local_238[0].data & 0xffffffff00000000);
                      fVar130 = 0.0;
                      fVar102 = 0.0;
                      uVar116 = 0xffffffff;
                      lVar98 = 0;
                      do {
                        iVar93 = (int)local_238[0].data;
                        switch(*(undefined1 *)(lVar110 + 0xc + lVar98)) {
                        case 1:
                          if (-1 < (int)uVar116) {
                            *(int *)((long)local_420 + (ulong)uVar116 * 4) =
                                 (int)local_238[0].data - iVar77;
                          }
                          uVar116 = uVar116 + 1;
                          auVar131 = pshuflw(ZEXT416(*(uint *)(lVar110 + lVar98)),
                                             ZEXT416(*(uint *)(lVar110 + lVar98)),0x60);
                          fVar130 = (float)(auVar131._0_4_ >> 0x10);
                          fVar102 = (float)(auVar131._4_4_ >> 0x10);
                          local_238[0].data =
                               (uchar *)CONCAT44(local_238[0].data._4_4_,(int)local_238[0].data + 1)
                          ;
                          iVar77 = iVar93;
                          if (local_450 != (ImFontConfig_conflict *)0x0) {
                            *(float *)(local_450->Name + (long)iVar93 * 8 + -0x56) = fVar130;
                            *(float *)(local_450->Name + (long)iVar93 * 8 + -0x56 + 4) = fVar102;
                          }
                          break;
                        case 2:
                          lVar95 = (long)(int)local_238[0].data;
                          auVar131 = pshuflw(ZEXT416(*(uint *)(lVar110 + lVar98)),
                                             ZEXT416(*(uint *)(lVar110 + lVar98)),0x60);
                          fVar130 = (float)(auVar131._0_4_ >> 0x10);
                          fVar102 = (float)(auVar131._4_4_ >> 0x10);
                          local_238[0].data =
                               (uchar *)CONCAT44(local_238[0].data._4_4_,(int)local_238[0].data + 1)
                          ;
                          if (local_450 != (ImFontConfig_conflict *)0x0) {
                            *(float *)(local_450->Name + lVar95 * 8 + -0x56) = fVar130;
                            *(float *)(local_450->Name + lVar95 * 8 + -0x56 + 4) = fVar102;
                          }
                          break;
                        case 3:
                          fVar155 = (float)(int)*(short *)(lVar110 + 6 + lVar98);
                          auVar145 = ZEXT416((uint)fVar155);
                          stbtt__tesselate_curve
                                    ((stbtt__point *)local_450,(int *)local_238,fVar130,fVar102,
                                     (float)(int)*(short *)(lVar110 + 4 + lVar98),fVar155,
                                     (float)(int)*(short *)(lVar110 + lVar98),
                                     (float)(int)*(short *)(lVar110 + 2 + lVar98),local_3c4,0);
                          goto LAB_001cabf9;
                        case 4:
                          fVar155 = (float)(int)*(short *)(lVar110 + 6 + lVar98);
                          auVar145 = ZEXT416((uint)fVar155);
                          stbtt__tesselate_cubic
                                    ((stbtt__point *)local_450,(int *)local_238,fVar130,fVar102,
                                     (float)(int)*(short *)(lVar110 + 4 + lVar98),fVar155,
                                     (float)(int)*(short *)(lVar110 + 8 + lVar98),
                                     (float)(int)*(short *)(lVar110 + 10 + lVar98),
                                     (float)(int)*(short *)(lVar110 + lVar98),
                                     (float)(int)*(short *)(lVar110 + 2 + lVar98),local_3c4,0);
LAB_001cabf9:
                          auVar131 = pshuflw(ZEXT416(*(uint *)(lVar110 + lVar98)),
                                             ZEXT416(*(uint *)(lVar110 + lVar98)),0x60);
                          fVar130 = (float)(auVar131._0_4_ >> 0x10);
                          fVar102 = (float)(auVar131._4_4_ >> 0x10);
                        }
                        pIVar100 = local_450;
                        lVar98 = lVar98 + 0xe;
                      } while ((ulong)uVar112 * 0xe != lVar98);
                      *(int *)((long)local_420 + (long)(int)uVar116 * 4) =
                           (int)local_238[0].data - iVar77;
                      bVar87 = true;
                      iVar93 = (int)local_238[0].data;
                      bVar63 = false;
                    } while (bVar96);
                    if (local_450 != (ImFontConfig_conflict *)0x0) {
                      lVar110 = 0;
                      lVar98 = 0;
                      do {
                        lVar98 = (long)(int)lVar98 + (long)*(int *)((long)local_420 + lVar110 * 4);
                        lVar110 = lVar110 + 1;
                      } while (CONCAT44(uVar170,uVar75) != lVar110);
                      local_438 = (stbtt__edge *)ImGui::MemAlloc(lVar98 * 0x14 + 0x14);
                      if (local_438 != (stbtt__edge *)0x0) {
                        lVar110 = 0;
                        uVar112 = 0;
                        iVar93 = 0;
                        do {
                          iVar77 = *(int *)((long)local_420 + lVar110 * 4);
                          if (0 < iVar77) {
                            lVar98 = (long)iVar93;
                            uVar94 = (ulong)(iVar77 - 1);
                            uVar78 = 0;
                            iVar158 = iVar77;
                            do {
                              iVar113 = (int)uVar94;
                              fVar130 = *(float *)(local_450->Name +
                                                  (long)iVar113 * 8 + lVar98 * 8 + -0x52);
                              fVar102 = *(float *)(pIVar100->Name + uVar78 * 8 + lVar98 * 8 + -0x52)
                              ;
                              if ((fVar130 != fVar102) || (NAN(fVar130) || NAN(fVar102))) {
                                iVar114 = (int)uVar78;
                                iVar158 = iVar113;
                                if (fVar130 <= fVar102) {
                                  iVar158 = iVar114;
                                  iVar114 = iVar113;
                                }
                                local_438[(int)uVar112].invert = (uint)(fVar102 < fVar130);
                                uVar172 = *(undefined8 *)
                                           (local_450->Name + (long)iVar158 * 8 + lVar98 * 8 + -0x56
                                           );
                                uVar191 = *(undefined8 *)
                                           (local_450->Name + (long)iVar114 * 8 + lVar98 * 8 + -0x56
                                           );
                                psVar104 = local_438 + (int)uVar112;
                                psVar104->x0 = (float)uVar172 * (float)local_248._0_4_ + 0.0;
                                psVar104->y0 = (float)((ulong)uVar172 >> 0x20) *
                                               (float)local_248._4_4_ + 0.0;
                                psVar104->x1 = (float)uVar191 * fStack_240 + 0.0;
                                psVar104->y1 = (float)((ulong)uVar191 >> 0x20) * fStack_23c + 0.0;
                                uVar112 = uVar112 + 1;
                                iVar158 = *(int *)((long)local_420 + lVar110 * 4);
                              }
                              uVar94 = uVar78 & 0xffffffff;
                              uVar78 = uVar78 + 1;
                            } while ((long)uVar78 < (long)iVar158);
                          }
                          iVar93 = iVar93 + iVar77;
                          lVar110 = lVar110 + 1;
                        } while (lVar110 != CONCAT44(uVar170,uVar75));
                        stbtt__sort_edges_quicksort(local_438,uVar112);
                        if (1 < (int)uVar112) {
                          uVar78 = 1;
                          lVar110 = 2;
                          psVar104 = local_438;
                          do {
                            uVar1 = local_438[uVar78].x0;
                            uVar2 = local_438[uVar78].y0;
                            iVar93 = local_438[uVar78].invert;
                            local_238[0].cursor = iVar93;
                            local_238[0].data = *(uchar **)&local_438[uVar78].x1;
                            lVar98 = lVar110;
                            psVar111 = psVar104;
                            do {
                              if (psVar111->y0 <= (float)uVar2) {
                                uVar75 = (int)lVar98 - 1;
                                goto LAB_001cae4e;
                              }
                              psVar111[1].invert = psVar111->invert;
                              fVar130 = psVar111->y0;
                              fVar102 = psVar111->x1;
                              fVar155 = psVar111->y1;
                              psVar111[1].x0 = psVar111->x0;
                              psVar111[1].y0 = fVar130;
                              psVar111[1].x1 = fVar102;
                              psVar111[1].y1 = fVar155;
                              lVar98 = lVar98 + -1;
                              psVar111 = psVar111 + -1;
                            } while (1 < lVar98);
                            uVar75 = 0;
LAB_001cae4e:
                            if (uVar78 != uVar75) {
                              local_438[(int)uVar75].x0 = (float)uVar1;
                              local_438[(int)uVar75].y0 = (float)uVar2;
                              *(uchar **)&local_438[(int)uVar75].x1 = local_238[0].data;
                              local_438[(int)uVar75].invert = iVar93;
                            }
                            uVar78 = uVar78 + 1;
                            lVar110 = lVar110 + 1;
                            psVar104 = psVar104 + 1;
                          } while (uVar78 != uVar112);
                        }
                        local_448 = (undefined1  [8])0x0;
                        scanline = local_238;
                        if (0x3f < (int)(uint)local_428) {
                          scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3fc * 8 + 4);
                        }
                        local_438[(int)uVar112].y0 = (float)(iVar76 + local_404) + 1.0;
                        if ((uint)local_3d0 < 0x7fffffff) {
                          local_300 = (long)(int)local_3fc;
                          local_35c = (float)(int)local_498._0_4_;
                          local_370 = (float *)((long)&scanline->data + local_300 * 4);
                          local_328 = local_370 + 1;
                          local_2f0 = local_300 * 4;
                          local_2f8 = (long)(int)(uint)local_428 * 4 + 8;
                          local_400 = (float)(int)local_3fc;
                          local_388 = 0;
                          local_380 = 0;
                          local_3b0 = (undefined8 *)0x0;
                          local_3c8 = 0;
                          local_418 = (stbtt__active_edge *)0x0;
                          auVar83 = (undefined1  [8])(stbtt__active_edge *)0x0;
                          psVar104 = local_438;
                          iVar76 = local_404;
                          do {
                            local_368 = iVar76;
                            iVar76 = local_404;
                            fVar130 = (float)local_368;
                            fVar102 = fVar130 + 1.0;
                            memset(scanline,0,local_2f0);
                            memset(local_370,0,local_2f8);
                            if (auVar83 != (undefined1  [8])0x0) {
                              psVar85 = (stbtt__active_edge *)local_448;
                              do {
                                if (((stbtt__active_edge *)auVar83)->ey <= fVar130) {
                                  psVar85->next = ((stbtt__active_edge *)auVar83)->next;
                                  if ((((stbtt__active_edge *)auVar83)->direction == 0.0) &&
                                     (!NAN(((stbtt__active_edge *)auVar83)->direction))) {
                                    __assert_fail("z->direction",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                                  ,0xc63,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  ((stbtt__active_edge *)auVar83)->direction = 0.0;
                                  ((stbtt__active_edge *)auVar83)->next = local_418;
                                  local_418 = (stbtt__active_edge *)auVar83;
                                  auVar83 = (undefined1  [8])psVar85;
                                }
                                ppsVar62 = &((stbtt__active_edge *)auVar83)->next;
                                psVar85 = (stbtt__active_edge *)auVar83;
                                auVar83 = (undefined1  [8])*ppsVar62;
                              } while (*ppsVar62 != (stbtt__active_edge *)0x0);
                            }
                            fVar155 = psVar104->y0;
                            if (fVar155 <= fVar102) {
                              bVar63 = (int)local_380 == 0;
                              do {
                                psVar85 = local_418;
                                fVar156 = psVar104->y1;
                                if ((fVar155 != fVar156) || (NAN(fVar155) || NAN(fVar156))) {
                                  if (local_418 == (stbtt__active_edge *)0x0) {
                                    if (local_3c8 == 0) {
                                      puVar84 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                      if (puVar84 == (undefined8 *)0x0) {
                                        __assert_fail("z != __null",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                                  ,0xad1,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                  );
                                      }
                                      *puVar84 = local_3b0;
                                      fVar155 = psVar104->y0;
                                      fVar156 = psVar104->y1;
                                      local_3c8 = 799;
                                    }
                                    else {
                                      local_3c8 = local_3c8 + -1;
                                      puVar84 = local_3b0;
                                    }
                                    local_3b0 = puVar84;
                                    psVar85 = (stbtt__active_edge *)
                                              (puVar84 + (long)local_3c8 * 4 + 1);
                                    local_418 = (stbtt__active_edge *)0x0;
                                  }
                                  else {
                                    local_418 = local_418->next;
                                  }
                                  fVar157 = psVar104->x0;
                                  fVar159 = (psVar104->x1 - fVar157) / (fVar156 - fVar155);
                                  psVar85->fdx = fVar159;
                                  psVar85->fdy = (float)(-(uint)(fVar159 != 0.0) &
                                                        (uint)(1.0 / fVar159));
                                  psVar85->fx = ((fVar130 - fVar155) * fVar159 + fVar157) -
                                                local_35c;
                                  psVar85->direction =
                                       *(float *)(&DAT_0020ffd8 + (ulong)(psVar104->invert == 0) * 4
                                                 );
                                  psVar85->sy = fVar155;
                                  psVar85->ey = fVar156;
                                  psVar85->next = (stbtt__active_edge *)0x0;
                                  if (fVar156 < fVar130 && (bVar63 && iVar76 != 0)) {
                                    psVar85->ey = fVar130;
                                    fVar156 = fVar130;
                                  }
                                  if (fVar156 < fVar130) {
                                    __assert_fail("z->ey >= scan_y_top",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                                  ,0xc76,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                 );
                                  }
                                  psVar85->next = (stbtt__active_edge *)local_448;
                                  local_448 = (undefined1  [8])psVar85;
                                }
                                else {
                                }
                                fVar155 = psVar104[1].y0;
                                psVar104 = psVar104 + 1;
                              } while (fVar155 <= fVar102);
                            }
                            if (local_448 != (undefined1  [8])0x0) {
                              local_2c8 = psVar104;
                              auVar83 = local_448;
                              do {
                                fVar155 = ((stbtt__active_edge *)auVar83)->ey;
                                if (fVar155 < fVar130) {
                                  __assert_fail("e->ey >= y_top",
                                                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                                ,0xba5,
                                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                               );
                                }
                                fVar156 = ((stbtt__active_edge *)auVar83)->fx;
                                auVar202._0_8_ = CONCAT44(0,fVar156);
                                auVar202._8_8_ = 0;
                                fVar157 = ((stbtt__active_edge *)auVar83)->fdx;
                                if ((fVar157 != 0.0) || (NAN(fVar157))) {
                                  fVar159 = ((stbtt__active_edge *)auVar83)->sy;
                                  if (fVar102 < fVar159) {
                                    __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                                  ,3000,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  fVar166 = fVar157 + fVar156;
                                  fVar164 = (float)(~-(uint)(fVar130 < fVar159) & (uint)fVar156 |
                                                   (uint)((fVar159 - fVar130) * fVar157 + fVar156) &
                                                   -(uint)(fVar130 < fVar159));
                                  if ((((fVar164 < 0.0) ||
                                       (fVar167 = (float)(~-(uint)(fVar155 < fVar102) &
                                                          (uint)fVar166 |
                                                         (uint)((fVar155 - fVar130) * fVar157 +
                                                               fVar156) & -(uint)(fVar155 < fVar102)
                                                         ), fVar167 < 0.0)) ||
                                      (local_400 <= fVar164)) || (local_400 <= fVar167)) {
                                    if ((uint)local_428 < 0x7fffffff) {
                                      local_3e8 = ZEXT416((uint)fVar166);
                                      local_358 = fVar157;
                                      local_348 = auVar202;
                                      uVar112 = 0;
                                      do {
                                        fVar157 = (float)(int)uVar112;
                                        uVar75 = uVar112 + 1;
                                        fVar155 = (float)(int)uVar75;
                                        fVar156 = local_348._0_4_;
                                        fVar159 = (fVar157 - fVar156) / local_358 + fVar130;
                                        fVar164 = (fVar155 - fVar156) / local_358 + fVar130;
                                        fVar166 = local_3e8._0_4_;
                                        if ((fVar157 <= fVar156) || (fVar166 <= fVar155)) {
                                          if ((fVar157 <= fVar166) || (fVar156 <= fVar155)) {
                                            fVar167 = fVar130;
                                            if (((fVar157 <= fVar156) || (fVar166 <= fVar157)) &&
                                               ((fVar157 <= fVar166 || (fVar156 <= fVar157)))) {
                                              if (((fVar156 < fVar155) && (fVar155 < fVar166)) ||
                                                 ((fVar157 = fVar156, fVar159 = fVar130,
                                                  fVar166 < fVar155 && (fVar155 < fVar156)))) {
                                                local_498._0_4_ = fVar155;
                                                fVar157 = fVar130;
                                                fVar159 = fVar164;
                                                goto LAB_001cb4a5;
                                              }
                                              goto LAB_001cb559;
                                            }
                                          }
                                          else {
                                            local_498._0_4_ = fVar155;
                                            stbtt__handle_clipped_edge
                                                      ((float *)scanline,uVar112,
                                                       (stbtt__active_edge *)auVar83,fVar156,fVar130
                                                       ,fVar155,fVar164);
                                            fVar156 = (float)local_498._0_4_;
                                            fVar167 = fVar164;
                                          }
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar112,
                                                     (stbtt__active_edge *)auVar83,fVar156,fVar167,
                                                     fVar157,fVar159);
                                        }
                                        else {
                                          local_498._0_4_ = fVar155;
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar112,
                                                     (stbtt__active_edge *)auVar83,fVar156,fVar130,
                                                     fVar157,fVar159);
                                          fVar156 = fVar157;
                                          fVar155 = (float)local_498._0_4_;
                                          fVar157 = fVar159;
                                          fVar159 = fVar164;
LAB_001cb4a5:
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar112,
                                                     (stbtt__active_edge *)auVar83,fVar156,fVar157,
                                                     fVar155,fVar159);
                                          fVar157 = (float)local_498._0_4_;
                                        }
LAB_001cb559:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar112,
                                                   (stbtt__active_edge *)auVar83,fVar157,fVar159,
                                                   local_3e8._0_4_,fVar102);
                                        uVar112 = uVar75;
                                      } while (local_3fc != uVar75);
                                    }
                                  }
                                  else {
                                    if (fVar159 <= fVar130) {
                                      fVar159 = fVar130;
                                    }
                                    uVar112 = (uint)fVar164;
                                    if (fVar102 <= fVar155) {
                                      fVar155 = fVar102;
                                    }
                                    uVar75 = (uint)fVar167;
                                    if (uVar112 == uVar75) {
                                      if (((int)uVar112 < 0) ||
                                         ((int)(uint)local_428 < (int)uVar112)) {
                                        __assert_fail("x >= 0 && x < len",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                                  ,0xbd4,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar78 = (ulong)uVar112;
                                      *(float *)((long)&scanline->data + uVar78 * 4) =
                                           (((fVar167 - (float)(int)uVar112) +
                                            (fVar164 - (float)(int)uVar112)) * -0.5 + 1.0) *
                                           ((stbtt__active_edge *)auVar83)->direction *
                                           (fVar155 - fVar159) +
                                           *(float *)((long)&scanline->data + uVar78 * 4);
                                      fVar156 = (fVar155 - fVar159) *
                                                ((stbtt__active_edge *)auVar83)->direction;
                                    }
                                    else {
                                      fVar157 = ((stbtt__active_edge *)auVar83)->fdy;
                                      uVar116 = uVar112;
                                      fVar169 = fVar164;
                                      if (fVar167 < fVar164) {
                                        fVar156 = fVar130 - fVar159;
                                        fVar159 = (fVar130 - fVar155) + fVar102;
                                        fVar157 = -fVar157;
                                        uVar116 = uVar75;
                                        uVar75 = uVar112;
                                        fVar155 = fVar156 + fVar102;
                                        fVar169 = fVar167;
                                        fVar167 = fVar164;
                                        fVar156 = fVar166;
                                      }
                                      iVar76 = uVar116 + 1;
                                      fVar166 = ((float)iVar76 - fVar156) * fVar157 + fVar130;
                                      fVar156 = ((stbtt__active_edge *)auVar83)->direction;
                                      fVar164 = (fVar166 - fVar159) * fVar156;
                                      lVar110 = (long)(int)uVar116;
                                      *(float *)((long)&scanline->data + lVar110 * 4) =
                                           (((fVar169 - (float)(int)uVar116) + 1.0) * -0.5 + 1.0) *
                                           fVar164 + *(float *)((long)&scanline->data + lVar110 * 4)
                                      ;
                                      if (uVar75 - iVar76 != 0 && iVar76 <= (int)uVar75) {
                                        do {
                                          *(float *)((long)&scanline->data + lVar110 * 4 + 4) =
                                               fVar157 * fVar156 * 0.5 + fVar164 +
                                               *(float *)((long)&scanline->data + lVar110 * 4 + 4);
                                          fVar164 = fVar164 + fVar157 * fVar156;
                                          lVar110 = lVar110 + 1;
                                        } while (uVar75 - 1 != (int)lVar110);
                                      }
                                      if (1.01 < ABS(fVar164)) {
                                        __assert_fail("fabsf(area) <= 1.01f",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                                  ,0xbfb,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      uVar78 = (ulong)(int)uVar75;
                                      *(float *)((long)&scanline->data + uVar78 * 4) =
                                           (fVar155 -
                                           (fVar157 * (float)(int)(uVar75 - iVar76) + fVar166)) *
                                           (((fVar167 - (float)(int)uVar75) + 0.0) * -0.5 + 1.0) *
                                           fVar156 + fVar164 +
                                           *(float *)((long)&scanline->data + uVar78 * 4);
                                      fVar156 = (fVar155 - fVar159) * fVar156;
                                    }
                                    local_328[uVar78] = fVar156 + local_328[uVar78];
                                  }
                                }
                                else if (fVar156 < local_400) {
                                  if (0.0 <= fVar156) {
                                    local_348 = auVar202;
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,(int)fVar156,
                                               (stbtt__active_edge *)auVar83,fVar156,fVar130,fVar156
                                               ,fVar102);
                                    iVar76 = (int)fVar156 + 1;
                                    auVar138 = local_348;
                                  }
                                  else {
                                    iVar76 = 0;
                                    auVar138._8_8_ = 0;
                                    auVar138._0_8_ = auVar202._0_8_;
                                  }
                                  stbtt__handle_clipped_edge
                                            (local_370,iVar76,(stbtt__active_edge *)auVar83,
                                             auVar138._0_4_,fVar130,auVar138._0_4_,fVar102);
                                }
                                auVar83 = (undefined1  [8])((stbtt__active_edge *)auVar83)->next;
                                psVar104 = local_2c8;
                              } while (auVar83 != (undefined1  [8])0x0);
                            }
                            uVar112 = (uint)DAT_001fd5c0;
                            auVar145._0_12_ = ZEXT812(0x437f0000);
                            auVar145._12_4_ = 0.0;
                            auVar83 = local_448;
                            if ((uint)local_428 < 0x7fffffff) {
                              fVar130 = 0.0;
                              psVar86 = scanline;
                              uVar78 = local_388;
                              lVar110 = local_300;
                              do {
                                fVar130 = fVar130 + *(float *)((long)&psVar86->data + local_300 * 4)
                                ;
                                iVar76 = (int)((float)((uint)(*(float *)&psVar86->data + fVar130) &
                                                      uVar112) * 255.0 + 0.5);
                                if (0xfe < iVar76) {
                                  iVar76 = 0xff;
                                }
                                local_2e8[(int)uVar78] = (uchar)iVar76;
                                uVar78 = (ulong)((int)uVar78 + 1);
                                psVar86 = (stbtt__buf *)((long)&psVar86->data + 4);
                                lVar110 = lVar110 + -1;
                              } while (lVar110 != 0);
                            }
                            for (; auVar83 != (undefined1  [8])0x0;
                                auVar83 = (undefined1  [8])((stbtt__active_edge *)auVar83)->next) {
                              ((stbtt__active_edge *)auVar83)->fx =
                                   ((stbtt__active_edge *)auVar83)->fdx +
                                   ((stbtt__active_edge *)auVar83)->fx;
                            }
                            iVar93 = (int)local_380;
                            local_380 = (ulong)(iVar93 + 1);
                            local_388 = (ulong)(uint)((int)local_388 + (int)local_42c);
                            puVar84 = local_3b0;
                            auVar83 = local_448;
                            iVar76 = local_368 + 1;
                          } while (iVar93 != (uint)local_3d0);
                          while (puVar84 != (undefined8 *)0x0) {
                            puVar11 = (undefined8 *)*puVar84;
                            ImGui::MemFree(puVar84);
                            puVar84 = puVar11;
                          }
                        }
                        pIVar100 = local_450;
                        if (scanline != local_238) {
                          ImGui::MemFree(scanline);
                        }
                        ImGui::MemFree(local_438);
                      }
                      ImGui::MemFree(local_420);
                      ImGui::MemFree(pIVar100);
                    }
                  }
                }
              }
LAB_001cb93c:
              ImGui::MemFree((void *)CONCAT44(local_410._4_4_,(stbtt_uint32)local_410));
              uVar78 = (ulong)*(ushort *)(local_378 + 8);
              uVar64 = *(ushort *)(local_378 + 10);
              uVar127 = *(ushort *)(local_378 + 4);
              uVar112 = (uint)uVar127;
              uVar65 = *(ushort *)(local_378 + 6);
              iVar76 = (int)local_470;
              auVar131 = _DAT_00225ac0;
              fVar130 = (float)local_468._0_4_;
              if (1 < (byte)local_318) {
                local_238[0].data = (uchar *)0x0;
                uVar75 = 0;
                if (uVar65 == 0) {
                  uVar65 = 0;
                }
                else {
                  uVar112 = (uint)uVar65;
                  puVar82 = local_390 +
                            (long)(int)((uint)uVar64 * (int)local_42c) +
                            (ulong)*(ushort *)(local_378 + 8);
                  iVar76 = (uint)uVar127 - local_488._0_4_;
                  uVar116 = iVar76 + 1;
                  uVar78 = (ulong)uVar116;
                  do {
                    uVar94 = local_318;
                    memset(local_238,0,local_318);
                    auVar131 = _DAT_00225ac0;
                    uVar170 = local_488._0_4_;
                    uVar90 = uVar116;
                    switch((int)uVar94) {
                    case 2:
                      if (iVar76 < 0) {
LAB_001cbc4d:
                        uVar94 = 0;
                        uVar90 = 0;
                      }
                      else {
                        uVar106 = 0;
                        uVar94 = 0;
                        do {
                          bVar118 = puVar82[uVar106];
                          bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 + 2 & 7)) =
                               bVar118;
                          uVar89 = (int)uVar94 + ((uint)bVar118 - (uint)bVar3);
                          uVar94 = (ulong)uVar89;
                          puVar82[uVar106] = (uchar)(uVar89 >> 1);
                          uVar106 = uVar106 + 1;
                        } while (uVar78 != uVar106);
                      }
                      break;
                    case 3:
                      if (iVar76 < 0) goto LAB_001cbc4d;
                      uVar106 = 0;
                      uVar94 = 0;
                      do {
                        bVar118 = puVar82[uVar106];
                        bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 + 3 & 7)) =
                             bVar118;
                        uVar94 = (ulong)((int)uVar94 + ((uint)bVar118 - (uint)bVar3));
                        puVar82[uVar106] = (uchar)(uVar94 / 3);
                        uVar106 = uVar106 + 1;
                      } while (uVar78 != uVar106);
                      break;
                    case 4:
                      if (iVar76 < 0) goto LAB_001cbc4d;
                      uVar106 = 0;
                      uVar94 = 0;
                      do {
                        bVar118 = puVar82[uVar106];
                        uVar105 = (ulong)((uint)uVar106 & 7);
                        bVar3 = *(byte *)((long)&local_238[0].data + uVar105);
                        *(byte *)((long)&local_238[0].data + (uVar105 ^ 4)) = bVar118;
                        uVar89 = (int)uVar94 + ((uint)bVar118 - (uint)bVar3);
                        uVar94 = (ulong)uVar89;
                        puVar82[uVar106] = (uchar)(uVar89 >> 2);
                        uVar106 = uVar106 + 1;
                      } while (uVar78 != uVar106);
                      break;
                    case 5:
                      if (iVar76 < 0) goto LAB_001cbc4d;
                      uVar106 = 0;
                      uVar94 = 0;
                      do {
                        bVar118 = puVar82[uVar106];
                        bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 + 5 & 7)) =
                             bVar118;
                        uVar94 = (ulong)((int)uVar94 + ((uint)bVar118 - (uint)bVar3));
                        puVar82[uVar106] = (uchar)(uVar94 / 5);
                        uVar106 = uVar106 + 1;
                      } while (uVar78 != uVar106);
                      break;
                    default:
                      if (iVar76 < 0) {
                        uVar94 = 0;
                        uVar90 = 0;
                      }
                      else {
                        uVar106 = 0;
                        uVar94 = 0;
                        do {
                          bVar118 = puVar82[uVar106];
                          bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)(uVar170 + (uint)uVar106 & 7))
                               = bVar118;
                          uVar94 = (ulong)((int)uVar94 + ((uint)bVar118 - (uint)bVar3));
                          puVar82[uVar106] = (uchar)(uVar94 / ((ulong)local_488 & 0xffffffff));
                          uVar106 = uVar106 + 1;
                        } while (uVar78 != uVar106);
                      }
                    }
                    if ((int)uVar90 < (int)(uint)uVar127) {
                      uVar106 = (ulong)uVar90;
                      do {
                        if (puVar82[uVar106] != '\0') {
                          __assert_fail("pixels[i] == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                        ,0xf41,
                                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar90 = (int)uVar94 -
                                 (uint)*(byte *)((long)&local_238[0].data +
                                                (ulong)((uint)uVar106 & 7));
                        uVar94 = (ulong)uVar90;
                        puVar82[uVar106] = (uchar)(uVar90 / (uint)uVar170);
                        uVar106 = uVar106 + 1;
                      } while ((int)uVar106 < (int)(uint)uVar127);
                    }
                    puVar82 = puVar82 + lVar117;
                    uVar75 = uVar75 + 1;
                  } while (uVar75 != uVar112);
                  uVar78 = (ulong)*(ushort *)(local_378 + 8);
                  uVar64 = *(ushort *)(local_378 + 10);
                  uVar112 = (uint)*(ushort *)(local_378 + 4);
                  uVar65 = *(ushort *)(local_378 + 6);
                  iVar76 = (int)local_470;
                  fVar130 = (float)local_468._0_4_;
                }
              }
              sVar88 = (short)uVar78;
              if (1 < (byte)local_320) {
                local_238[0].data = (uchar *)0x0;
                uVar75 = 0;
                if ((short)uVar112 == 0) {
                  uVar112 = 0;
                }
                else {
                  pbVar115 = local_390 + (long)(int)((uint)uVar64 * (int)local_42c) + uVar78;
                  iVar76 = (uint)uVar65 - iVar76;
                  uVar116 = iVar76 + 1;
                  uVar78 = (ulong)uVar116;
                  do {
                    uVar94 = local_320;
                    memset(local_238,0,local_320);
                    auVar131 = _DAT_00225ac0;
                    uVar90 = uVar116;
                    switch((int)uVar94) {
                    case 2:
                      if (iVar76 < 0) {
LAB_001cc0ca:
                        uVar94 = 0;
                        uVar90 = 0;
                      }
                      else {
                        uVar106 = 0;
                        uVar94 = 0;
                        pbVar108 = pbVar115;
                        do {
                          bVar118 = *pbVar108;
                          bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 & 7));
                          *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 + 2 & 7)) =
                               bVar118;
                          uVar89 = (int)uVar94 + ((uint)bVar118 - (uint)bVar3);
                          uVar94 = (ulong)uVar89;
                          *pbVar108 = (byte)(uVar89 >> 1);
                          uVar106 = uVar106 + 1;
                          pbVar108 = pbVar108 + lVar117;
                        } while (uVar78 != uVar106);
                      }
                      break;
                    case 3:
                      if (iVar76 < 0) goto LAB_001cc0ca;
                      uVar106 = 0;
                      uVar94 = 0;
                      pbVar108 = pbVar115;
                      do {
                        bVar118 = *pbVar108;
                        bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 + 3 & 7)) =
                             bVar118;
                        uVar94 = (ulong)((int)uVar94 + ((uint)bVar118 - (uint)bVar3));
                        *pbVar108 = (byte)(uVar94 / 3);
                        uVar106 = uVar106 + 1;
                        pbVar108 = pbVar108 + lVar117;
                      } while (uVar78 != uVar106);
                      break;
                    case 4:
                      if (iVar76 < 0) goto LAB_001cc0ca;
                      uVar106 = 0;
                      uVar94 = 0;
                      pbVar108 = pbVar115;
                      do {
                        bVar118 = *pbVar108;
                        uVar105 = (ulong)((uint)uVar106 & 7);
                        bVar3 = *(byte *)((long)&local_238[0].data + uVar105);
                        *(byte *)((long)&local_238[0].data + (uVar105 ^ 4)) = bVar118;
                        uVar89 = (int)uVar94 + ((uint)bVar118 - (uint)bVar3);
                        uVar94 = (ulong)uVar89;
                        *pbVar108 = (byte)(uVar89 >> 2);
                        uVar106 = uVar106 + 1;
                        pbVar108 = pbVar108 + lVar117;
                      } while (uVar78 != uVar106);
                      break;
                    case 5:
                      if (iVar76 < 0) goto LAB_001cc0ca;
                      uVar106 = 0;
                      uVar94 = 0;
                      pbVar108 = pbVar115;
                      do {
                        bVar118 = *pbVar108;
                        bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 & 7));
                        *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 + 5 & 7)) =
                             bVar118;
                        uVar94 = (ulong)((int)uVar94 + ((uint)bVar118 - (uint)bVar3));
                        *pbVar108 = (byte)(uVar94 / 5);
                        uVar106 = uVar106 + 1;
                        pbVar108 = pbVar108 + lVar117;
                      } while (uVar78 != uVar106);
                      break;
                    default:
                      if (iVar76 < 0) {
                        uVar94 = 0;
                        uVar90 = 0;
                      }
                      else {
                        uVar106 = 0;
                        uVar94 = 0;
                        pbVar108 = pbVar115;
                        do {
                          bVar118 = *pbVar108;
                          bVar3 = *(byte *)((long)&local_238[0].data + (ulong)((uint)uVar106 & 7));
                          *(byte *)((long)&local_238[0].data +
                                   (ulong)((int)local_470 + (uint)uVar106 & 7)) = bVar118;
                          uVar94 = (ulong)((int)uVar94 + ((uint)bVar118 - (uint)bVar3));
                          *pbVar108 = (byte)(uVar94 / (local_470 & 0xffffffff));
                          uVar106 = uVar106 + 1;
                          pbVar108 = pbVar108 + lVar117;
                        } while (uVar78 != uVar106);
                      }
                    }
                    if ((int)uVar90 < (int)(uint)uVar65) {
                      lVar110 = (long)(int)uVar90;
                      pbVar108 = pbVar115 + lVar117 * lVar110;
                      do {
                        if (*pbVar108 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imstb_truetype.h"
                                        ,0xf7f,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar94 = (ulong)((int)uVar94 -
                                        (uint)*(byte *)((long)&local_238[0].data +
                                                       (ulong)((uint)lVar110 & 7)));
                        *pbVar108 = (byte)(uVar94 / (local_470 & 0xffffffff));
                        lVar110 = lVar110 + 1;
                        pbVar108 = pbVar108 + lVar117;
                      } while ((uint)uVar65 != (uint)lVar110);
                    }
                    pbVar115 = pbVar115 + 1;
                    uVar75 = uVar75 + 1;
                  } while (uVar75 != uVar112);
                  sVar88 = *(short *)(local_378 + 8);
                  uVar64 = *(ushort *)(local_378 + 10);
                  uVar112 = (uint)*(ushort *)(local_378 + 4);
                  uVar65 = *(ushort *)(local_378 + 6);
                  fVar130 = (float)local_468._0_4_;
                }
              }
              *local_2d8 = sVar88;
              local_2d8[1] = uVar64;
              local_2d8[2] = sVar88 + (short)uVar112;
              local_2d8[3] = uVar65 + uVar64;
              *(float *)(local_2d8 + 8) =
                   (float)(int)(short)((short)(local_360 << 8) + (short)local_364) * fVar130;
              *(ulong *)(local_2d8 + 4) =
                   CONCAT44((float)local_354 * local_268._4_4_ + local_258._4_4_,
                            (float)local_350 * local_268._0_4_ + local_258._0_4_);
              *(float *)(local_2d8 + 10) =
                   (float)(int)(uVar112 + local_350) * local_268._0_4_ + local_258._0_4_;
              *(float *)(local_2d8 + 0xc) =
                   (float)(int)((uint)uVar65 + local_354) * (float)local_278._0_4_ +
                   (float)local_288._0_4_;
              iVar76 = local_3b8[1].fontstart;
              lVar110 = local_2e0;
              lVar98 = local_2d0;
              atlas_00 = local_478;
              psVar99 = local_3b8;
            }
            lVar98 = lVar98 + 1;
          } while (lVar98 < iVar76);
        }
        fVar130 = local_308[local_3c0].RasterizerMultiply;
        _local_488 = ZEXT416((uint)fVar130);
        if ((fVar130 != 1.0) || (NAN(fVar130))) {
          local_488._4_4_ = fVar130;
          local_488._0_4_ = fVar130;
          fStack_480 = fVar130;
          fStack_47c = fVar130;
          lVar110 = 0;
          uVar112 = 0xc;
          uVar75 = 0xd;
          uVar116 = 0xe;
          uVar90 = 0xf;
          auVar134 = _DAT_001fe2f0;
          auVar139 = _DAT_001fe2e0;
          auVar146 = _DAT_00225a50;
          do {
            uVar137 = auVar139._0_4_;
            uVar141 = auVar139._4_4_;
            uVar142 = auVar139._12_4_;
            uVar165 = auVar139._8_4_;
            uVar89 = auVar134._0_4_;
            uVar135 = auVar134._4_4_;
            uVar136 = auVar134._12_4_;
            uVar178 = auVar134._8_4_;
            uVar143 = auVar146._0_4_;
            uVar147 = auVar146._4_4_;
            uVar148 = auVar146._12_4_;
            uVar198 = auVar146._8_4_;
            fVar181 = (((float)(uVar143 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar143 & 0xffff | 0x4b000000)) * fVar130;
            fVar185 = (((float)(uVar147 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar147 & 0xffff | 0x4b000000)) * fVar130;
            fVar186 = (((float)(uVar198 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar198 & 0xffff | 0x4b000000)) * fVar130;
            fVar187 = (((float)(uVar148 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar148 & 0xffff | 0x4b000000)) * fVar130;
            fVar169 = (((float)(uVar112 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar112 & 0xffff | 0x4b000000)) * fVar130;
            fVar177 = (((float)(uVar75 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar75 & 0xffff | 0x4b000000)) * fVar130;
            fVar179 = (((float)(uVar116 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar116 & 0xffff | 0x4b000000)) * fVar130;
            fVar180 = (((float)(uVar90 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar90 & 0xffff | 0x4b000000)) * fVar130;
            fVar159 = (((float)(uVar89 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar89 & 0xffff | 0x4b000000)) * fVar130;
            fVar164 = (((float)(uVar135 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar135 & 0xffff | 0x4b000000)) * fVar130;
            fVar166 = (((float)(uVar178 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar178 & 0xffff | 0x4b000000)) * fVar130;
            fVar167 = (((float)(uVar136 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar136 & 0xffff | 0x4b000000)) * fVar130;
            fVar102 = (((float)(uVar137 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar137 & 0xffff | 0x4b000000)) * fVar130;
            fVar155 = (((float)(uVar141 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar141 & 0xffff | 0x4b000000)) * fVar130;
            fVar156 = (((float)(uVar165 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar165 & 0xffff | 0x4b000000)) * fVar130;
            fVar157 = (((float)(uVar142 >> 0x10 | 0x53000000) - 5.497642e+11) +
                      (float)(uVar142 & 0xffff | 0x4b000000)) * fVar130;
            auVar154._0_4_ = (int)fVar102;
            auVar154._4_4_ = (int)fVar155;
            auVar154._8_4_ = (int)fVar156;
            auVar154._12_4_ = (int)fVar157;
            auVar199._0_4_ = auVar154._0_4_ >> 0x1f;
            auVar199._4_4_ = auVar154._4_4_ >> 0x1f;
            auVar199._8_4_ = auVar154._8_4_ >> 0x1f;
            auVar199._12_4_ = auVar154._12_4_ >> 0x1f;
            auVar153._0_4_ = (int)(fVar102 - 2.1474836e+09);
            auVar153._4_4_ = (int)(fVar155 - 2.1474836e+09);
            auVar153._8_4_ = (int)(fVar156 - 2.1474836e+09);
            auVar153._12_4_ = (int)(fVar157 - 2.1474836e+09);
            auVar154 = auVar153 & auVar199 | auVar154;
            auVar163._0_4_ = (int)fVar159;
            auVar163._4_4_ = (int)fVar164;
            auVar163._8_4_ = (int)fVar166;
            auVar163._12_4_ = (int)fVar167;
            auVar200._0_4_ = auVar163._0_4_ >> 0x1f;
            auVar200._4_4_ = auVar163._4_4_ >> 0x1f;
            auVar200._8_4_ = auVar163._8_4_ >> 0x1f;
            auVar200._12_4_ = auVar163._12_4_ >> 0x1f;
            auVar162._0_4_ = (int)(fVar159 - 2.1474836e+09);
            auVar162._4_4_ = (int)(fVar164 - 2.1474836e+09);
            auVar162._8_4_ = (int)(fVar166 - 2.1474836e+09);
            auVar162._12_4_ = (int)(fVar167 - 2.1474836e+09);
            auVar163 = auVar162 & auVar200 | auVar163;
            auVar195._0_4_ = (int)fVar169;
            auVar195._4_4_ = (int)fVar177;
            auVar195._8_4_ = (int)fVar179;
            auVar195._12_4_ = (int)fVar180;
            auVar204._0_4_ = auVar195._0_4_ >> 0x1f;
            auVar204._4_4_ = auVar195._4_4_ >> 0x1f;
            auVar204._8_4_ = auVar195._8_4_ >> 0x1f;
            auVar204._12_4_ = auVar195._12_4_ >> 0x1f;
            auVar194._0_4_ = (int)(fVar169 - 2.1474836e+09);
            auVar194._4_4_ = (int)(fVar177 - 2.1474836e+09);
            auVar194._8_4_ = (int)(fVar179 - 2.1474836e+09);
            auVar194._12_4_ = (int)(fVar180 - 2.1474836e+09);
            auVar195 = auVar194 & auVar204 | auVar195;
            auVar183._0_4_ = (int)fVar181;
            auVar183._4_4_ = (int)fVar185;
            auVar183._8_4_ = (int)fVar186;
            auVar183._12_4_ = (int)fVar187;
            auVar201._0_4_ = auVar183._0_4_ >> 0x1f;
            auVar201._4_4_ = auVar183._4_4_ >> 0x1f;
            auVar201._8_4_ = auVar183._8_4_ >> 0x1f;
            auVar201._12_4_ = auVar183._12_4_ >> 0x1f;
            auVar182._0_4_ = (int)(fVar181 - 2.1474836e+09);
            auVar182._4_4_ = (int)(fVar185 - 2.1474836e+09);
            auVar182._8_4_ = (int)(fVar186 - 2.1474836e+09);
            auVar182._12_4_ = (int)(fVar187 - 2.1474836e+09);
            auVar183 = auVar182 & auVar201 | auVar183;
            auVar202 = auVar183 ^ _DAT_001fd020;
            auVar175._0_4_ = -(uint)(auVar202._0_4_ < -0x7fffff01);
            auVar175._4_4_ = -(uint)(auVar202._4_4_ < -0x7fffff01);
            auVar175._8_4_ = -(uint)(auVar202._8_4_ < -0x7fffff01);
            auVar175._12_4_ = -(uint)(auVar202._12_4_ < -0x7fffff01);
            auVar202 = ~auVar175 & auVar131 | auVar183 & auVar175;
            auVar133 = auVar195 ^ _DAT_001fd020;
            auVar203._0_4_ = -(uint)(auVar133._0_4_ < -0x7fffff01);
            auVar203._4_4_ = -(uint)(auVar133._4_4_ < -0x7fffff01);
            auVar203._8_4_ = -(uint)(auVar133._8_4_ < -0x7fffff01);
            auVar203._12_4_ = -(uint)(auVar133._12_4_ < -0x7fffff01);
            auVar133 = ~auVar203 & auVar131 | auVar195 & auVar203;
            sVar88 = auVar202._0_2_;
            cVar13 = (0 < sVar88) * (sVar88 < 0x100) * auVar202[0] - (0xff < sVar88);
            sVar88 = auVar202._2_2_;
            sVar168 = CONCAT11((0 < sVar88) * (sVar88 < 0x100) * auVar202[2] - (0xff < sVar88),
                               cVar13);
            sVar88 = auVar202._4_2_;
            cVar125 = (0 < sVar88) * (sVar88 < 0x100) * auVar202[4] - (0xff < sVar88);
            sVar88 = auVar202._6_2_;
            uVar170 = CONCAT13((0 < sVar88) * (sVar88 < 0x100) * auVar202[6] - (0xff < sVar88),
                               CONCAT12(cVar125,sVar168));
            sVar88 = auVar202._8_2_;
            cVar14 = (0 < sVar88) * (sVar88 < 0x100) * auVar202[8] - (0xff < sVar88);
            sVar88 = auVar202._10_2_;
            uVar171 = CONCAT15((0 < sVar88) * (sVar88 < 0x100) * auVar202[10] - (0xff < sVar88),
                               CONCAT14(cVar14,uVar170));
            sVar88 = auVar202._12_2_;
            cVar15 = (0 < sVar88) * (sVar88 < 0x100) * auVar202[0xc] - (0xff < sVar88);
            sVar88 = auVar202._14_2_;
            uVar172 = CONCAT17((0 < sVar88) * (sVar88 < 0x100) * auVar202[0xe] - (0xff < sVar88),
                               CONCAT16(cVar15,uVar171));
            sVar88 = auVar133._0_2_;
            cVar16 = (0 < sVar88) * (sVar88 < 0x100) * auVar133[0] - (0xff < sVar88);
            sVar88 = auVar133._2_2_;
            auVar173._0_10_ =
                 CONCAT19((0 < sVar88) * (sVar88 < 0x100) * auVar133[2] - (0xff < sVar88),
                          CONCAT18(cVar16,uVar172));
            sVar88 = auVar133._4_2_;
            cVar17 = (0 < sVar88) * (sVar88 < 0x100) * auVar133[4] - (0xff < sVar88);
            auVar173[10] = cVar17;
            sVar88 = auVar133._6_2_;
            auVar173[0xb] = (0 < sVar88) * (sVar88 < 0x100) * auVar133[6] - (0xff < sVar88);
            sVar88 = auVar133._8_2_;
            cVar128 = (0 < sVar88) * (sVar88 < 0x100) * auVar133[8] - (0xff < sVar88);
            auVar174[0xc] = cVar128;
            auVar174._0_12_ = auVar173;
            sVar88 = auVar133._10_2_;
            auVar174[0xd] = (0 < sVar88) * (sVar88 < 0x100) * auVar133[10] - (0xff < sVar88);
            sVar88 = auVar133._12_2_;
            cVar126 = (0 < sVar88) * (sVar88 < 0x100) * auVar133[0xc] - (0xff < sVar88);
            auVar176[0xe] = cVar126;
            auVar176._0_14_ = auVar174;
            sVar88 = auVar133._14_2_;
            auVar176[0xf] = (0 < sVar88) * (sVar88 < 0x100) * auVar133[0xe] - (0xff < sVar88);
            auVar202 = auVar163 ^ _DAT_001fd020;
            auVar196._0_4_ = -(uint)(auVar202._0_4_ < -0x7fffff01);
            auVar196._4_4_ = -(uint)(auVar202._4_4_ < -0x7fffff01);
            auVar196._8_4_ = -(uint)(auVar202._8_4_ < -0x7fffff01);
            auVar196._12_4_ = -(uint)(auVar202._12_4_ < -0x7fffff01);
            auVar133 = ~auVar196 & auVar131 | auVar163 & auVar196;
            auVar202 = auVar154 ^ _DAT_001fd020;
            auVar184._0_4_ = -(uint)(auVar202._0_4_ < -0x7fffff01);
            auVar184._4_4_ = -(uint)(auVar202._4_4_ < -0x7fffff01);
            auVar184._8_4_ = -(uint)(auVar202._8_4_ < -0x7fffff01);
            auVar184._12_4_ = -(uint)(auVar202._12_4_ < -0x7fffff01);
            auVar202 = ~auVar184 & auVar131 | auVar154 & auVar184;
            sVar88 = auVar133._0_2_;
            cVar18 = (0 < sVar88) * (sVar88 < 0x100) * auVar133[0] - (0xff < sVar88);
            sVar88 = auVar133._2_2_;
            sVar188 = CONCAT11((0 < sVar88) * (sVar88 < 0x100) * auVar133[2] - (0xff < sVar88),
                               cVar18);
            sVar88 = auVar133._4_2_;
            cVar19 = (0 < sVar88) * (sVar88 < 0x100) * auVar133[4] - (0xff < sVar88);
            sVar88 = auVar133._6_2_;
            uVar189 = CONCAT13((0 < sVar88) * (sVar88 < 0x100) * auVar133[6] - (0xff < sVar88),
                               CONCAT12(cVar19,sVar188));
            sVar88 = auVar133._8_2_;
            cVar20 = (0 < sVar88) * (sVar88 < 0x100) * auVar133[8] - (0xff < sVar88);
            sVar88 = auVar133._10_2_;
            uVar190 = CONCAT15((0 < sVar88) * (sVar88 < 0x100) * auVar133[10] - (0xff < sVar88),
                               CONCAT14(cVar20,uVar189));
            sVar88 = auVar133._12_2_;
            cVar21 = (0 < sVar88) * (sVar88 < 0x100) * auVar133[0xc] - (0xff < sVar88);
            sVar88 = auVar133._14_2_;
            uVar191 = CONCAT17((0 < sVar88) * (sVar88 < 0x100) * auVar133[0xe] - (0xff < sVar88),
                               CONCAT16(cVar21,uVar190));
            sVar88 = auVar202._0_2_;
            cVar22 = (0 < sVar88) * (sVar88 < 0x100) * auVar202[0] - (0xff < sVar88);
            sVar88 = auVar202._2_2_;
            auVar192._0_10_ =
                 CONCAT19((0 < sVar88) * (sVar88 < 0x100) * auVar202[2] - (0xff < sVar88),
                          CONCAT18(cVar22,uVar191));
            sVar88 = auVar202._4_2_;
            cVar23 = (0 < sVar88) * (sVar88 < 0x100) * auVar202[4] - (0xff < sVar88);
            auVar192[10] = cVar23;
            sVar88 = auVar202._6_2_;
            auVar192[0xb] = (0 < sVar88) * (sVar88 < 0x100) * auVar202[6] - (0xff < sVar88);
            sVar88 = auVar202._8_2_;
            cVar24 = (0 < sVar88) * (sVar88 < 0x100) * auVar202[8] - (0xff < sVar88);
            auVar193[0xc] = cVar24;
            auVar193._0_12_ = auVar192;
            sVar88 = auVar202._10_2_;
            auVar193[0xd] = (0 < sVar88) * (sVar88 < 0x100) * auVar202[10] - (0xff < sVar88);
            sVar88 = auVar202._12_2_;
            cVar25 = (0 < sVar88) * (sVar88 < 0x100) * auVar202[0xc] - (0xff < sVar88);
            auVar197[0xe] = cVar25;
            auVar197._0_14_ = auVar193;
            sVar88 = auVar202._14_2_;
            auVar197[0xf] = (0 < sVar88) * (sVar88 < 0x100) * auVar202[0xe] - (0xff < sVar88);
            sVar88 = (short)((uint)uVar189 >> 0x10);
            sVar66 = (short)((uint6)uVar190 >> 0x20);
            sVar129 = (short)((ulong)uVar191 >> 0x30);
            sVar26 = (short)((unkuint10)auVar192._0_10_ >> 0x40);
            sVar27 = auVar192._10_2_;
            sVar28 = auVar193._12_2_;
            sVar29 = auVar197._14_2_;
            sVar30 = (short)((uint)uVar170 >> 0x10);
            sVar31 = (short)((uint6)uVar171 >> 0x20);
            sVar32 = (short)((ulong)uVar172 >> 0x30);
            sVar33 = (short)((unkuint10)auVar173._0_10_ >> 0x40);
            sVar34 = auVar173._10_2_;
            sVar35 = auVar174._12_2_;
            sVar36 = auVar176._14_2_;
            *(char *)((long)&local_238[0].data + lVar110) =
                 (0 < sVar188) * (sVar188 < 0x100) * cVar18 - (0xff < sVar188);
            *(char *)((long)&local_238[0].data + lVar110 + 1) =
                 (0 < sVar88) * (sVar88 < 0x100) * cVar19 - (0xff < sVar88);
            *(char *)((long)&local_238[0].data + lVar110 + 2) =
                 (0 < sVar66) * (sVar66 < 0x100) * cVar20 - (0xff < sVar66);
            *(char *)((long)&local_238[0].data + lVar110 + 3) =
                 (0 < sVar129) * (sVar129 < 0x100) * cVar21 - (0xff < sVar129);
            *(char *)((long)&local_238[0].data + lVar110 + 4) =
                 (0 < sVar26) * (sVar26 < 0x100) * cVar22 - (0xff < sVar26);
            *(char *)((long)&local_238[0].data + lVar110 + 5) =
                 (0 < sVar27) * (sVar27 < 0x100) * cVar23 - (0xff < sVar27);
            *(char *)((long)&local_238[0].data + lVar110 + 6) =
                 (0 < sVar28) * (sVar28 < 0x100) * cVar24 - (0xff < sVar28);
            *(char *)((long)&local_238[0].data + lVar110 + 7) =
                 (0 < sVar29) * (sVar29 < 0x100) * cVar25 - (0xff < sVar29);
            *(char *)((long)&local_238[0].cursor + lVar110) =
                 (0 < sVar168) * (sVar168 < 0x100) * cVar13 - (0xff < sVar168);
            *(char *)((long)&local_238[0].cursor + lVar110 + 1) =
                 (0 < sVar30) * (sVar30 < 0x100) * cVar125 - (0xff < sVar30);
            *(char *)((long)&local_238[0].cursor + lVar110 + 2) =
                 (0 < sVar31) * (sVar31 < 0x100) * cVar14 - (0xff < sVar31);
            *(char *)((long)&local_238[0].cursor + lVar110 + 3) =
                 (0 < sVar32) * (sVar32 < 0x100) * cVar15 - (0xff < sVar32);
            *(char *)((long)&local_238[0].size + lVar110) =
                 (0 < sVar33) * (sVar33 < 0x100) * cVar16 - (0xff < sVar33);
            *(char *)((long)&local_238[0].size + lVar110 + 1) =
                 (0 < sVar34) * (sVar34 < 0x100) * cVar17 - (0xff < sVar34);
            *(char *)((long)&local_238[0].size + lVar110 + 2) =
                 (0 < sVar35) * (sVar35 < 0x100) * cVar128 - (0xff < sVar35);
            *(char *)((long)&local_238[0].size + lVar110 + 3) =
                 (0 < sVar36) * (sVar36 < 0x100) * cVar126 - (0xff < sVar36);
            lVar110 = lVar110 + 0x10;
            iVar76 = (int)DAT_00225ad0;
            auVar134._0_4_ = uVar89 + iVar76;
            iVar93 = DAT_00225ad0._4_4_;
            auVar134._4_4_ = uVar135 + iVar93;
            iVar77 = DAT_00225ad0._8_4_;
            auVar134._8_4_ = uVar178 + iVar77;
            iVar158 = DAT_00225ad0._12_4_;
            auVar134._12_4_ = uVar136 + iVar158;
            auVar139._0_4_ = uVar137 + iVar76;
            auVar139._4_4_ = uVar141 + iVar93;
            auVar139._8_4_ = uVar165 + iVar77;
            auVar139._12_4_ = uVar142 + iVar158;
            auVar146._0_4_ = uVar143 + iVar76;
            auVar146._4_4_ = uVar147 + iVar93;
            auVar146._8_4_ = uVar198 + iVar77;
            auVar146._12_4_ = uVar148 + iVar158;
            uVar112 = uVar112 + iVar76;
            uVar75 = uVar75 + iVar93;
            uVar116 = uVar116 + iVar77;
            uVar90 = uVar90 + iVar158;
          } while (lVar110 != 0x100);
          iVar76 = psVar99[1].cff.cursor;
          if (0 < iVar76) {
            lVar98._0_4_ = psVar99[1].hmtx;
            lVar98._4_4_ = psVar99[1].kern;
            iVar93 = 0;
            do {
              if ((*(int *)(lVar98 + 0xc) != 0) && (*(ushort *)(lVar98 + 6) != 0)) {
                wVar97 = atlas_00->TexWidth;
                uVar64 = *(ushort *)(lVar98 + 4);
                puVar82 = atlas_00->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar98 + 10) * (long)wVar97 +
                          (ulong)*(ushort *)(lVar98 + 8);
                uVar112 = (uint)*(ushort *)(lVar98 + 6);
                do {
                  if ((ulong)uVar64 != 0) {
                    uVar78 = 0;
                    do {
                      puVar82[uVar78] =
                           *(uchar *)((long)&local_238[0].data + (ulong)puVar82[uVar78]);
                      uVar78 = uVar78 + 1;
                    } while (uVar64 != uVar78);
                  }
                  puVar82 = puVar82 + wVar97;
                  bVar63 = 1 < (int)uVar112;
                  uVar112 = uVar112 - 1;
                } while (bVar63);
                iVar76 = psVar99[1].cff.cursor;
              }
              iVar93 = iVar93 + 1;
              lVar98 = lVar98 + 0x10;
            } while (iVar93 < iVar76);
          }
        }
        psVar99[1].hmtx = 0;
        psVar99[1].kern = 0;
      }
      lVar110 = local_3c0 + 1;
    } while (lVar110 != lVar91);
  }
  ImGui::MemFree(local_440);
  ImGui::MemFree(local_330);
  pvVar81 = pvStack_3f0;
  if (pvStack_3f0 != (void *)0x0) {
    auVar54._8_8_ = 0;
    auVar54._0_8_ = pvStack_3f0;
    _local_3f8 = (stbtt__buf)(auVar54 << 0x40);
    ImGui::MemFree(pvVar81);
    pvStack_3f0._0_4_ = 0;
    pvStack_3f0._4_4_ = 0;
  }
  if ((int)uVar8 < 1) {
    if (local_4d8 == (void *)0x0) goto LAB_001cc9be;
  }
  else {
    lVar110 = 0;
    auVar124._0_12_ = DAT_0020dbe0._0_12_;
    auVar124._12_2_ = DAT_0020dbe0._6_2_;
    auVar124._14_2_ = DAT_0020dbe0._6_2_;
    auVar123._12_4_ = auVar124._12_4_;
    auVar123._0_10_ = (unkbyte10)DAT_0020dbe0;
    auVar123._10_2_ = DAT_0020dbe0._4_2_;
    auVar122._10_6_ = auVar123._10_6_;
    auVar122._0_8_ = (undefined8)DAT_0020dbe0;
    auVar122._8_2_ = DAT_0020dbe0._4_2_;
    local_498._8_8_ = auVar122._8_8_;
    local_498._6_2_ = DAT_0020dbe0._2_2_;
    local_498._4_2_ = DAT_0020dbe0._2_2_;
    local_498._0_2_ = (undefined2)DAT_0020dbe0;
    local_498._2_2_ = local_498._0_2_;
    do {
      uVar170 = (undefined4)lVar110;
      uVar189 = (undefined4)((ulong)lVar110 >> 0x20);
      lVar117 = lVar110 * 0x110;
      iVar76 = *(int *)((long)local_4d8 + lVar117 + 0xe8);
      if (iVar76 != 0) {
        if ((local_478->ConfigData).Size <= lVar110) goto LAB_001ccb0c;
        pIVar12 = (local_478->ConfigData).Data;
        pIVar100 = pIVar12 + lVar110;
        pIVar9 = pIVar12[lVar110].DstFont;
        if (pIVar12[lVar110].MergeMode == true) {
          uVar7 = pIVar9->ConfigDataCount;
          sVar88 = uVar7 + 1;
          fVar130 = pIVar9->Ascent;
        }
        else {
          _local_488 = ZEXT416((uint)pIVar12[lVar110].SizePixels);
          lVar110 = *(long *)((long)local_4d8 + lVar117 + 8);
          lVar98 = (long)*(int *)((long)local_4d8 + lVar117 + 0x24);
          bVar118 = *(byte *)(lVar110 + 4 + lVar98);
          bVar3 = *(byte *)(lVar110 + 5 + lVar98);
          bVar4 = *(byte *)(lVar110 + 7 + lVar98);
          bVar5 = *(byte *)(lVar110 + 6 + lVar98);
          ImFont::ClearOutputData(pIVar9);
          iVar76 = (uint)bVar5 * 0x100 + (uint)bVar118;
          auVar43._1_9_ = (unkuint9)0 << 8;
          auVar43[0] = (char)((uint)iVar76 >> 0x10);
          auVar43._10_6_ = 0;
          auVar58._1_12_ = SUB1612(auVar43 << 0x28,4);
          auVar58[0] = (char)((uint)iVar76 >> 8);
          auVar58[0xd] = 0;
          auVar59._1_14_ = auVar58 << 8;
          auVar59[0] = (char)iVar76;
          auVar59[0xf] = 0;
          auVar131 = ZEXT416((uint)bVar3 | (uint)bVar4 << 0x10) | auVar59 << 8;
          sVar66 = auVar131._0_2_;
          sVar88 = auVar131._2_2_;
          fVar102 = (float)((int)sVar66 - (int)sVar88);
          sVar129 = auVar131._4_2_;
          auVar60._4_6_ = 0;
          auVar60._0_4_ = fVar102;
          auVar60._10_2_ = sVar129;
          auVar61._8_4_ = auVar60._8_4_;
          auVar61._6_2_ = sVar88;
          auVar61._4_2_ = (short)((uint)fVar102 >> 0x10);
          auVar61._0_4_ = fVar102;
          auVar140._0_2_ = -(ushort)(sVar66 < (short)local_498._0_2_);
          auVar140._2_2_ = -(ushort)(sVar66 < (short)local_498._2_2_);
          auVar140._4_2_ = -(ushort)(sVar88 < (short)local_498._4_2_);
          auVar140._6_2_ = -(ushort)(sVar88 < (short)local_498._6_2_);
          auVar140._8_2_ = -(ushort)(sVar129 < (short)local_498._8_2_);
          auVar140._10_2_ = -(ushort)(sVar129 < (short)local_498._10_2_);
          auVar140._12_2_ = -(ushort)(0 < (short)local_498._12_2_);
          auVar140._14_2_ = -(ushort)(0 < (short)local_498._14_2_);
          auVar131 = auVar140 & _DAT_0020f4c0 | ~auVar140 & _DAT_001ff530;
          fVar130 = (float)(int)(((float)local_488._0_4_ / fVar102) * (float)(int)sVar66 +
                                auVar131._0_4_);
          pIVar9->FontSize = pIVar100->SizePixels;
          pIVar9->ConfigData = pIVar100;
          pIVar9->ContainerAtlas = local_478;
          pIVar9->Ascent = fVar130;
          pIVar9->Descent =
               (float)(int)(((float)local_488._0_4_ / fVar102) * (float)(auVar61._4_4_ >> 0x10) +
                           auVar131._4_4_);
          iVar76 = *(int *)((long)local_4d8 + lVar117 + 0xe8);
          sVar88 = 1;
        }
        pIVar9->ConfigDataCount = sVar88;
        if (0 < iVar76) {
          local_488._0_4_ = (pIVar100->GlyphOffset).x;
          fVar130 = (float)(int)(fVar130 + 0.5) + (pIVar100->GlyphOffset).y;
          lVar98 = 0;
          lVar110 = 0;
          do {
            if (*(int *)((long)local_4d8 + lVar117 + 0x100) <= lVar110) goto LAB_001cca52;
            lVar95 = *(long *)((long)local_4d8 + lVar117 + 0xd0);
            fVar155 = 1.0 / (float)local_478->TexHeight;
            fVar102 = 1.0 / (float)local_478->TexWidth;
            ImFont::AddGlyph(pIVar9,pIVar100,
                             *(ImWchar *)
                              (*(long *)((long)local_4d8 + lVar117 + 0x108) + lVar110 * 4),
                             *(float *)(lVar95 + 8 + lVar98) + 0.0 + (float)local_488._0_4_,
                             *(float *)(lVar95 + 0xc + lVar98) + 0.0 + fVar130,
                             *(float *)(lVar95 + 0x14 + lVar98) + 0.0 + (float)local_488._0_4_,
                             *(float *)(lVar95 + 0x18 + lVar98) + 0.0 + fVar130,
                             (float)*(ushort *)(lVar95 + lVar98) * fVar102,
                             (float)*(ushort *)(lVar95 + 2 + lVar98) * fVar155,
                             (float)*(ushort *)(lVar95 + 4 + lVar98) * fVar102,
                             (float)*(ushort *)(lVar95 + 6 + lVar98) * fVar155,
                             *(float *)(lVar95 + 0x10 + lVar98));
            lVar110 = lVar110 + 1;
            lVar98 = lVar98 + 0x1c;
          } while (lVar110 < *(int *)((long)local_4d8 + lVar117 + 0xe8));
        }
      }
      atlas_00 = local_478;
      lVar110 = CONCAT44(uVar189,uVar170) + 1;
    } while (lVar110 != lVar91);
    if (0 < (int)uVar8) {
      sVar101 = 0;
      do {
        pvVar81 = *(void **)((long)local_4d8 + sVar101 + 0x108);
        if (pvVar81 != (void *)0x0) {
          ImGui::MemFree(pvVar81);
        }
        pvVar81 = *(void **)((long)local_4d8 + sVar101 + 0xf8);
        if (pvVar81 != (void *)0x0) {
          ImGui::MemFree(pvVar81);
        }
        sVar101 = sVar101 + 0x110;
      } while (local_310 != sVar101);
    }
  }
  ImGui::MemFree(local_4d8);
LAB_001cc9be:
  ImFontAtlasBuildFinish((ImFontAtlas *)atlas_00);
  if (pvStack_3a0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3a0);
  }
  return true;
LAB_001ccba2:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_001cca67;
LAB_001ccb0c:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_001cca67;
LAB_001cca52:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_001cca67:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x706,__function);
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}